

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

void lj_asm_trace(jit_State *J,GCtrace *T)

{
  IROp1 *pIVar1;
  char *pcVar2;
  char cVar3;
  uint8_t uVar4;
  ushort uVar5;
  short sVar6;
  ushort uVar7;
  CTypeID id;
  ExitNo exitno;
  SnapShot *pSVar8;
  uint64_t uVar9;
  SnapEntry *pSVar10;
  GCtrace *T_00;
  undefined1 uVar11;
  MCode *pMVar12;
  TValue TVar13;
  byte bVar14;
  Reg RVar15;
  CTInfo CVar16;
  Reg RVar17;
  Reg rb;
  TRef TVar18;
  MSize MVar19;
  MCode *p_1;
  GCtrace *pGVar20;
  IRIns *pIVar21;
  byte *pbVar22;
  MCode MVar23;
  undefined4 uVar24;
  MCode *p;
  BCReg BVar42;
  int iVar43;
  uint uVar44;
  long lVar25;
  uint16_t *puVar26;
  void *addr;
  code *pcVar27;
  byte bVar28;
  BCReg BVar29;
  x86Shift xs;
  IRCallID id_00;
  IRRef IVar30;
  ulong uVar31;
  IRIns u64;
  IRIns IVar32;
  byte *pbVar33;
  byte *pbVar34;
  uint *u64_00;
  CCallInfo *pCVar35;
  RegSet blocked;
  x86Op xVar36;
  uint uVar37;
  IRIns *unaff_RBP;
  undefined7 uVar39;
  ushort *puVar38;
  byte bVar40;
  IRRef1 IVar41;
  undefined4 uVar45;
  code *target;
  int32_t iVar46;
  long lVar47;
  MCode MVar48;
  MCode MVar49;
  uint uVar50;
  RegSet RVar51;
  uint uVar52;
  ulong uVar53;
  RegSet RVar54;
  IRIns *pIVar55;
  int iVar56;
  IRIns IVar57;
  bool bVar58;
  bool bVar59;
  CTSize sz;
  IRRef args [64];
  ushort auStack_10372 [32545];
  code *pcStack_530;
  IRIns local_528;
  uint local_51c;
  undefined8 local_518;
  IRIns *local_510;
  ASMState local_508;
  IRIns *local_178;
  uint local_16c;
  ulong local_168;
  jit_State *local_160;
  GCtrace *local_158;
  IRIns local_150;
  uint32_t local_148;
  global_State *local_140;
  TValue local_138;
  uint32_t local_130;
  undefined4 local_12c;
  
  uVar31 = (ulong)(T->nins - 1);
  cVar3 = *(char *)((long)T->ir + uVar31 * 8 + 5);
  if ((cVar3 == '\x14') || (cVar3 == '\f')) {
    while ((cVar3 = *(char *)((long)T->ir + uVar31 * 8 + -3), cVar3 == '\x14' || (cVar3 == '\f'))) {
      uVar31 = uVar31 - 1;
    }
    T->nins = (IRRef)uVar31;
  }
  uVar37 = (J->cur).nins;
  if (J->irtoplim <= uVar37) {
    pcStack_530 = (code *)0x13f9f3;
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar37 + 1;
  (J->cur).ir[uVar37] = (IRIns)0xc0000000000;
  pcStack_530 = (code *)0x13a59e;
  local_508.J = J;
  local_508.orignins = uVar37;
  local_508.T = T;
  pGVar20 = lj_trace_alloc(J->L,T);
  J->curfinal = pGVar20;
  local_508.flags = J->flags;
  local_508.loopref = J->loopref;
  local_508.realign = (byte *)0x0;
  local_508.loopinv = 0;
  if ((ulong)J->parent == 0) {
    local_508.parent = (GCtrace *)0x0;
  }
  else {
    local_508.parent = (GCtrace *)J->trace[J->parent].gcptr64;
  }
  pcStack_530 = (code *)0x13a607;
  local_508.mcp = lj_mcode_reserve(J,&local_508.mcbot);
  local_508.mctoporig = local_508.mcp;
  local_508.mctop = local_508.mcp;
  local_508.mclim = local_508.mcbot + 0x40;
  uVar5 = (local_508.T)->nsnap;
  if (0x1ff < uVar5) {
    pcStack_530 = (code *)0x13fa52;
    lj_trace_err(local_508.J,LJ_TRERR_SNAPOV);
  }
  if (uVar5 != 0) {
    MVar23 = '\x01';
    uVar31 = 0;
    do {
      pMVar12 = local_508.mcbot;
      if ((local_508.J)->exitstubgroup[uVar31] == (MCode *)0x0) {
        if (local_508.mcp <= local_508.mcbot + 0x8d) goto LAB_0013f81a;
        *local_508.mcbot = 'j';
        local_508.mcbot[1] = (MCode)((int)uVar31 << 5);
        MVar48 = 'z';
        lVar25 = 0;
        MVar49 = MVar23;
        do {
          lVar47 = lVar25;
          local_508.mcbot[lVar47 + 2] = 0xeb;
          local_508.mcbot[lVar47 + 3] = MVar48;
          local_508.mcbot[lVar47 + 4] = 'j';
          local_508.mcbot[lVar47 + 5] = MVar49;
          MVar49 = MVar49 + '\x01';
          MVar48 = MVar48 + 0xfc;
          lVar25 = lVar47 + 4;
        } while ((int)(lVar47 + 4) != 0x7c);
        local_508.mcbot[lVar47 + 6] = 'j';
        local_508.mcbot[lVar47 + 7] = (MCode)(uVar31 >> 3);
        local_508.mcbot[lVar47 + 8] = 0xe9;
        *(int *)(local_508.mcbot + lVar47 + 9) = 0x1265c6 - (int)local_508.mcbot;
        (local_508.J)->mcbot = local_508.mcbot + lVar47 + 0xd;
        local_508.mcbot = local_508.mcbot + lVar47 + 0xd;
        local_508.mclim = pMVar12 + lVar47 + 0x4d;
        (local_508.J)->exitstubgroup[uVar31] = pMVar12;
      }
      uVar31 = uVar31 + 1;
      MVar23 = MVar23 + ' ';
    } while (uVar31 != uVar5 + 0x1f >> 5);
  }
  local_508.mrm._4_2_ = local_508.mrm._4_2_ & 0xff00;
  local_140 = (global_State *)&J[-1].penalty[0x24].val;
  local_158 = T;
  local_160 = J;
LAB_0013a764:
  local_508.mcp = local_508.mctop;
  local_508.ir = J->curfinal->ir;
  (J->cur).nins = local_508.orignins;
  local_508.curins = local_508.orignins;
  pbVar34 = local_508.mctop;
  if (local_508.realign != (byte *)0x0) {
    if (((ulong)local_508.realign & 0xf) != 0) {
      pbVar34 = local_508.mctop + ~(ulong)(((uint)local_508.realign & 0xf) - 1);
      pcStack_530 = (code *)0x13a7c8;
      memset(pbVar34,0x90,(ulong)((uint)local_508.realign & 0xf));
    }
    local_508.mctop = pbVar34;
    pbVar34 = pbVar34 + (ulong)(local_508.loopinv == 0) * 3;
  }
  if (local_508.loopref == 0) {
    local_508.mcp = pbVar34 + -0xc;
    local_508.invmcp = (byte *)0x0;
  }
  else {
    local_508.mcp = pbVar34 + -5;
    local_508.invmcp = pbVar34 + -5;
  }
  local_508.mcloop = (byte *)0x0;
  local_508.flagmcp = (byte *)0x0;
  local_508.topslot = 0;
  local_508.gcsteps = 0;
  local_508.sectref = local_508.loopref;
  local_508.fuseref = local_508.loopref;
  if ((local_508.flags >> 0x19 & 1) == 0) {
    local_508.fuseref = 0xffffffff;
  }
  uVar4 = (local_508.T)->sinktags;
  uVar39 = (undefined7)((ulong)unaff_RBP >> 8);
  unaff_RBP = (IRIns *)CONCAT71(uVar39,uVar4);
  local_508.curins = (local_508.T)->nins;
  uVar31 = (ulong)local_508.curins;
  local_508.freeset = 0xffffbfef;
  local_508.modset = 0;
  local_508.weakset = 0;
  local_508.phiset = 0;
  local_508.phireg[0x18] = 0;
  local_508.phireg[0x19] = 0;
  local_508.phireg[0x1a] = 0;
  local_508.phireg[0x1b] = 0;
  local_508.phireg[0x1c] = 0;
  local_508.phireg[0x1d] = 0;
  local_508.phireg[0x1e] = 0;
  local_508.phireg[0x1f] = 0;
  local_508.phireg[0x10] = 0;
  local_508.phireg[0x11] = 0;
  local_508.phireg[0x12] = 0;
  local_508.phireg[0x13] = 0;
  local_508.phireg[0x14] = 0;
  local_508.phireg[0x15] = 0;
  local_508.phireg[0x16] = 0;
  local_508.phireg[0x17] = 0;
  local_508.phireg[8] = 0;
  local_508.phireg[9] = 0;
  local_508.phireg[10] = 0;
  local_508.phireg[0xb] = 0;
  local_508.phireg[0xc] = 0;
  local_508.phireg[0xd] = 0;
  local_508.phireg[0xe] = 0;
  local_508.phireg[0xf] = 0;
  local_508.phireg[0] = 0;
  local_508.phireg[1] = 0;
  local_508.phireg[2] = 0;
  local_508.phireg[3] = 0;
  local_508.phireg[4] = 0;
  local_508.phireg[5] = 0;
  local_508.phireg[6] = 0;
  local_508.phireg[7] = 0;
  lVar25 = 0;
  do {
    local_508.cost[lVar25] = 0xffff0000;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x20);
  if ((ulong)(local_508.T)->nk < 0x8000) {
    lVar25 = (ulong)(local_508.T)->nk << 3;
    do {
      *(undefined2 *)((long)local_508.ir + lVar25 + 6) = 0xff;
      if (((0x605fd9U >> (*(uint *)((long)local_508.ir + lVar25 + 4) & 0x1f) & 1) != 0) &&
         (*(char *)((long)local_508.ir + lVar25 + 5) != '\x1b')) {
        *(undefined4 *)((long)local_508.ir + lVar25) = 0;
        lVar25 = lVar25 + 8;
      }
      bVar58 = lVar25 < 0x3fff8;
      lVar25 = lVar25 + 8;
    } while (bVar58);
  }
  *(undefined2 *)((long)local_508.ir + 0x40006) = 0x82;
  local_508.snaprename = local_508.curins;
  local_508.snapref = local_508.curins;
  local_508.snapno = (uint)(local_508.T)->nsnap;
  local_508.snapalloc = 0;
  local_508.stopins = 0x8000;
  local_508.orignins = local_508.curins;
  pIVar55 = local_508.ir + 0x8001;
  if (local_508.parent != (GCtrace *)0x0) {
    pcStack_530 = (code *)0x13a976;
    pIVar21 = lj_snap_regspmap(local_508.J,local_508.parent,(local_508.J)->exitno,pIVar55);
    if (2000 < (long)pIVar21 - (long)pIVar55) {
LAB_0013f9f8:
      pcStack_530 = (code *)0x13fa0a;
      lj_trace_err(local_508.J,LJ_TRERR_NYICOAL);
    }
    local_508.stopins = (uint)((ulong)((long)pIVar21 + (-8 - (long)local_508.ir)) >> 3);
    if (pIVar55 < pIVar21) {
      puVar26 = local_508.parentmap;
      do {
        uVar5 = (pIVar55->field_0).prev;
        *puVar26 = uVar5;
        puVar26 = puVar26 + 1;
        IVar41 = uVar5 | 0x80;
        if (0xff < uVar5) {
          IVar41 = 0xff;
        }
        (pIVar55->field_0).prev = IVar41;
        pIVar55 = pIVar55 + 1;
      } while (pIVar55 < pIVar21);
    }
  }
  local_508.evenspill = 2;
  pIVar21 = local_508.ir + uVar31;
  if (pIVar55 < pIVar21) {
    bVar58 = false;
LAB_0013aa0a:
    if (uVar4 != '\0') {
      if ((pIVar55->field_1).r != 0xfe) {
        if ((pIVar55->field_1).r != 0xfd) goto LAB_0013aa30;
        (pIVar55->field_1).r = 0xfe;
      }
      goto LAB_0013aca3;
    }
LAB_0013aa30:
    switch((pIVar55->field_1).o) {
    case '\x10':
      uVar37 = *(byte *)((long)pIVar55 + -3) - 0x5f;
      if ((4 < uVar37) || (uVar37 == 1)) goto switchD_0013aa49_caseD_42;
      *(undefined2 *)((long)pIVar55 + -2) = 0x80;
      (pIVar55->field_0).prev = 0x82;
      break;
    case '\x11':
switchD_0013aa49_caseD_11:
      bVar58 = true;
      goto switchD_0013aa49_caseD_42;
    default:
switchD_0013aa49_caseD_12:
      if ((((short)(pIVar55->field_0).op2 < 0) || (-1 < (short)(pIVar55->field_0).op1)) ||
         (IVar41 = *(IRRef1 *)((long)local_508.ir + (ulong)(pIVar55->field_0).op1 * 8 + 6),
         0xfc < (byte)IVar41)) goto switchD_0013aa49_caseD_42;
      (pIVar55->field_0).prev = IVar41;
      break;
    case '$':
    case '%':
    case '&':
      if ((local_508.flags & 0x40) == 0) goto switchD_0013aa49_caseD_27;
      goto switchD_0013aa49_caseD_42;
    case '\'':
    case '(':
switchD_0013aa49_caseD_27:
      uVar5 = (pIVar55->field_0).op2;
      if (((short)uVar5 < 0) && (0xfc < *(byte *)((long)local_508.ir + (ulong)uVar5 * 8 + 6))) {
        *(undefined1 *)((long)local_508.ir + (ulong)uVar5 * 8 + 6) = 0x81;
        if (!bVar58) goto LAB_0013ac99;
        local_508._168_8_ = local_508._168_8_ | 0x200000000;
        goto switchD_0013aa49_caseD_11;
      }
      goto switchD_0013aa49_caseD_42;
    case ',':
    case '-':
switchD_0013aa49_caseD_2c:
      if (((pIVar55->field_1).t.irt & 0x1f) == 0xe) goto switchD_0013aa49_caseD_42;
      (pIVar55->field_0).prev = 0x80;
      if (!bVar58) goto LAB_0013ac7b;
      local_508._168_8_ = local_508._168_8_ | 0xfc700000000;
LAB_0013aa66:
      bVar58 = true;
      break;
    case '.':
      if (((pIVar55->field_1).t.irt & 0x1f) != 0xe) goto switchD_0013aa49_caseD_2c;
LAB_0013ac80:
      if (bVar58) {
        local_508._168_8_ = local_508._168_8_ | 0xffff0fc700000000;
      }
      (pIVar55->field_0).prev = 0x90;
      break;
    case '4':
      if (2 < (pIVar55->field_0).op2) goto LAB_0013ac80;
      if ((local_508.flags & 0x20) == 0) {
        (pIVar55->field_0).prev = 0x90;
        if (!bVar58) goto LAB_0013ac7b;
        local_508._168_8_ = local_508._168_8_ | 0xf000100000000;
        goto LAB_0013aa66;
      }
      goto switchD_0013aa49_caseD_42;
    case ';':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
    case 'V':
    case 'W':
    case ']':
      (pIVar55->field_0).prev = 0x80;
      if (bVar58) {
        local_508.modset = 0xffff0fc7;
        goto LAB_0013aa66;
      }
LAB_0013ac7b:
      bVar58 = false;
      break;
    case 'B':
    case 'C':
    case 'D':
    case 'F':
    case 'H':
    case '\\':
      goto switchD_0013aa49_caseD_42;
    case 'Y':
    case '^':
      if (bVar58) {
        local_508.modset = 0xffff0fc7;
        goto switchD_0013aa49_caseD_11;
      }
LAB_0013ac99:
      bVar58 = false;
      goto switchD_0013aa49_caseD_42;
    case '[':
      if ((1 < (byte)(((pIVar55->field_1).t.irt & 0x1f) - 0xd)) &&
         (1 < (ushort)(((pIVar55->field_0).op2 & 0x1f) - 0xd))) goto switchD_0013aa49_caseD_12;
switchD_0013aa49_caseD_42:
      (pIVar55->field_0).prev = 0xff;
      break;
    case '_':
    case '`':
    case 'b':
      goto switchD_0013aa49_caseD_5f;
    case 'a':
      if (((pIVar55->field_0).op2 == 0x25) && (local_508.evenspill < 4)) {
        local_508.evenspill = 4;
      }
      goto switchD_0013aa49_caseD_5f;
    case 'c':
      pcStack_530 = (code *)0x13ac1c;
      local_130 = asm_callx_flags(&local_508,pIVar55);
      pcStack_530 = (code *)0x13ac36;
      RVar15 = asm_setup_call_slots(&local_508,pIVar55,(CCallInfo *)&local_138.gcr);
      (pIVar55->field_0).prev = (IRRef1)RVar15;
      if (bVar58) {
        local_508._168_8_ = local_508._168_8_ | 0xffff0fc700000000;
      }
    }
    goto LAB_0013aca3;
  }
LAB_0013acb0:
  local_508.oddspill = local_508.evenspill;
  if ((local_508.evenspill & 1U) == 0) {
    local_508.oddspill = 0;
  }
  else {
    local_508.evenspill = local_508.evenspill + 1;
  }
  if (local_508.loopref == 0) {
    uVar53 = (ulong)((local_508.T)->nsnap - 1);
    pSVar8 = (local_508.T)->snap;
    uVar31 = (ulong)pSVar8[uVar53].nent;
    if (uVar31 == 0) {
      unaff_RBP = (IRIns *)0x0;
      uVar37 = 0;
    }
    else {
      uVar11 = 0;
      do {
        bVar58 = ((local_508.T)->snapmap[(ulong)pSVar8[uVar53].mapofs + (uVar31 - 1)] >> 0x10 & 1)
                 != 0;
        if (bVar58) {
          uVar11 = 1;
        }
        pIVar21 = (IRIns *)(ulong)(((local_508.T)->snapmap
                                    [(ulong)pSVar8[uVar53].mapofs + (uVar31 - 1)] >> 0x18) - 1);
        if (!bVar58) {
          pIVar21 = (IRIns *)((ulong)pIVar55 & 0xffffffff);
        }
        uVar37 = (uint)pIVar21;
        if (bVar58) goto LAB_0013ad48;
        uVar31 = uVar31 - 1;
        pIVar55 = pIVar21;
      } while (uVar31 != 0);
      uVar37 = 0;
LAB_0013ad48:
      unaff_RBP = (IRIns *)CONCAT71(uVar39,uVar11);
    }
    pSVar8 = pSVar8 + uVar53;
    local_508.topslot = (uint)pSVar8->topslot;
    if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
    pcStack_530 = (code *)0x13ad8f;
    ra_allocref(&local_508,0x8000,4);
    if ((local_508.T)->link == 0) {
      u64_00 = (uint *)(*(ulong *)((local_508.T)->snapmap + ((uint)pSVar8->nent + pSVar8->mapofs))
                       >> 8);
      if (((char)*u64_00 == 'W') &&
         (uVar9 = (local_508.J)->trace[*u64_00 >> 0x10].gcptr64,
         0xfffffffb < *(byte *)(uVar9 + 0x50) - 0x4d)) {
        u64_00 = (uint *)(uVar9 + 0x50);
      }
      pcStack_530 = (code *)0x13ae26;
      emit_loadu64(&local_508,3,(uint64_t)u64_00);
      iVar56 = ~uVar37 + (uint)pSVar8->nslots;
      uVar44 = *u64_00;
      uVar52 = (uVar44 & 0xff) - 0x3f;
      uVar52 = uVar52 >> 1 | (uint)((uVar52 & 1) != 0) << 0x1f;
      if (uVar52 - 1 < 2) {
        iVar56 = (iVar56 - ((uVar44 >> 0x10 & 0xff) + (uVar44 >> 8 & 0xff))) + -2;
      }
      else {
        if (uVar52 == 0) {
          uVar44 = uVar44 >> 8 & 0xff;
        }
        else {
          if (uVar52 != 5) {
            if ((uVar44 & 0xff) < 0x59) {
              iVar56 = 0;
            }
            goto LAB_0013ae83;
          }
          uVar44 = (uVar44 >> 0x10) + (uVar44 >> 8 & 0xff);
        }
        iVar56 = iVar56 - uVar44;
      }
LAB_0013ae83:
      if ((iVar56 == 0) && ((*local_508.mcp == 0xf || ((*local_508.mcp & 0xf0) != 0x70)))) {
        (local_508.mcp + -2)[0] = 0x33;
        (local_508.mcp + -2)[1] = 0xc0;
        local_508.mcp = local_508.mcp + -2;
      }
      else {
        *(int *)(local_508.mcp + -4) = iVar56;
        local_508.mcp[-5] = 0xb8;
        local_508.mcp = local_508.mcp + -5;
      }
    }
    else if (uVar37 != 0) {
      pcStack_530 = (code *)0x13adcd;
      emit_rma(&local_508,XO_MOVto,0x80202,local_508.J[-1].penalty + 0x3c);
    }
    local_51c = (uint)unaff_RBP;
    if (uVar37 != 0) {
      iVar56 = uVar37 * 8;
      if ((char)(byte)iVar56 == iVar56) {
        local_508.mcp[-1] = (byte)iVar56;
        local_508.mcp = local_508.mcp + -1;
        uVar45 = 0x830000fe;
      }
      else {
        *(int *)(local_508.mcp + -4) = iVar56;
        local_508.mcp = local_508.mcp + -4;
        uVar45 = 0x810000fe;
      }
      local_508.mcp[-1] = 0xc2;
      *(undefined4 *)(local_508.mcp + -5) = uVar45;
      local_508.mcp[-3] = 0x48;
      local_508.mcp = local_508.mcp + -3;
    }
    if ((ulong)(local_508.J)->ktrace != 0) {
      local_508.ir[(ulong)(local_508.J)->ktrace + 1] = (IRIns)(local_508.J)->curfinal;
      *(undefined1 *)((long)local_508.ir + (ulong)(local_508.J)->ktrace * 8 + 5) = 0x18;
    }
    IVar32.gcr.gcptr64._1_7_ = 0;
    IVar32.field_0.op1._0_1_ = pSVar8->nent;
    local_518 = uVar53;
    if (IVar32 != (IRIns)0x0) {
      uVar37 = pSVar8->mapofs;
      pSVar10 = (local_508.T)->snapmap;
      IVar57 = (IRIns)0x0;
      local_528 = IVar32;
      do {
        uVar44 = pSVar10[(ulong)uVar37 + (long)IVar57];
        unaff_RBP = (IRIns *)(ulong)uVar44;
        if ((uVar44 >> 0x12 & 1) == 0) {
          iVar56 = (uVar44 >> 0x18) * 8 + -0x10;
          uVar50 = (uVar44 >> 0x18) * 8;
          pIVar55 = (IRIns *)((ulong)((uVar44 & 0xffff) * 8) + (long)local_508.ir);
          uVar52 = uVar44 & 0xffff;
          if ((uVar44 >> 0x14 & 1) == 0) {
            if (((pIVar55->field_1).t.irt & 0x1f) == 0xe) {
              RVar15 = (Reg)(pIVar55->field_1).r;
              if ((char)(pIVar55->field_1).r < '\0') {
                pcStack_530 = (code *)0x13afc1;
                RVar15 = ra_allocref(&local_508,uVar44 & 0xffff,0xffff0000);
              }
              bVar28 = (byte)RVar15 & 0x1f;
              local_508.weakset = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
              xVar36 = XO_MOVSDto;
            }
            else {
              if (uVar52 < 0x8000) {
                pcStack_530 = (code *)0x13b046;
                lj_ir_kvalue((local_508.J)->L,&local_138,pIVar55);
                IVar32 = local_528;
                if (local_138.u64 != 0xffffffffffffffff) {
                  *(uint32_t *)(local_508.mcp + -4) = local_138.field_4.it;
                  if (uVar50 < 0x8c) {
                    local_508.mcp[-5] = (byte)(uVar50 - 0xc);
                    pbVar34 = local_508.mcp + -5;
                    bVar28 = 0x42;
                  }
                  else {
                    *(uint *)(local_508.mcp + -8) = uVar50 - 0xc;
                    pbVar34 = local_508.mcp + -8;
                    bVar28 = 0x82;
                  }
                  pbVar34[-1] = bVar28;
                  pbVar34[-2] = 199;
                  uVar45 = local_138.field_4.i;
                  goto LAB_0013b236;
                }
                pbVar34 = local_508.mcp + -4;
                pbVar33 = local_508.mcp + -4;
                pbVar33[0] = 0xff;
                pbVar33[1] = 0xff;
                pbVar33[2] = 0xff;
                pbVar33[3] = 0xff;
                if (iVar56 == 0) {
                  bVar28 = 2;
                }
                else if (uVar44 < 0x12000000) {
                  local_508.mcp[-5] = (byte)iVar56;
                  pbVar34 = local_508.mcp + -5;
                  bVar28 = 0x42;
                }
                else {
                  *(int *)(local_508.mcp + -8) = iVar56;
                  pbVar34 = local_508.mcp + -8;
                  bVar28 = 0x82;
                }
                pbVar34[-1] = bVar28;
                pbVar34[-3] = 0x48;
                pbVar34[-2] = 199;
                local_508.mcp = pbVar34 + -3;
                goto LAB_0013b277;
              }
              RVar15 = (Reg)(pIVar55->field_1).r;
              if ((char)(pIVar55->field_1).r < '\0') {
                pcStack_530 = (code *)0x13b129;
                RVar15 = ra_allocref(&local_508,uVar52,0xbfeb);
              }
              bVar28 = (byte)RVar15 & 0x1f;
              local_508.weakset = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
              uVar44 = (pIVar55->field_1).t.irt & 0x1f;
              uVar52 = ~uVar44;
              if ((0x605fd9U >> uVar44 & 1) == 0) {
                *(uint *)(local_508.mcp + -4) = uVar52 << 0xf | 0x7fff;
                if (uVar50 < 0x8c) {
                  local_508.mcp[-5] = (byte)(uVar50 - 0xc);
                  local_508.mcp = local_508.mcp + -5;
                  bVar28 = 199;
                  bVar14 = 0x42;
                }
                else {
                  *(uint *)(local_508.mcp + -8) = uVar50 - 0xc;
                  local_508.mcp = local_508.mcp + -8;
                  bVar28 = 199;
                  bVar14 = 0x82;
                }
              }
              else {
                *(uint *)(local_508.mcp + -4) = uVar52 << 0xf;
                if (uVar50 < 0x8c) {
                  local_508.mcp[-5] = (byte)(uVar50 - 0xc);
                  local_508.mcp = local_508.mcp + -5;
                  bVar28 = 0x81;
                  bVar14 = 0x4a;
                }
                else {
                  *(uint *)(local_508.mcp + -8) = uVar50 - 0xc;
                  local_508.mcp = local_508.mcp + -8;
                  bVar28 = 0x81;
                  bVar14 = 0x8a;
                }
              }
              local_508.mcp[-1] = bVar14;
              local_508.mcp[-2] = bVar28;
              local_508.mcp = local_508.mcp + -2;
              uVar44._0_2_ = *(IROpT *)((long)pIVar55 + 4);
              uVar44._2_2_ = *(IRRef1 *)((long)pIVar55 + 6);
              RVar15 = -(uint)((0x605fd9U >> (uVar44 & 0x1f) & 1) != 0) & 0x80200 | RVar15;
              xVar36 = XO_MOVto;
            }
LAB_0013b0fb:
            pcStack_530 = (code *)0x13b108;
            emit_rmro(&local_508,xVar36,RVar15,2,iVar56);
            IVar32 = local_528;
          }
          else {
            pbVar34 = local_508.mcp + -4;
            pbVar34[0] = 0xff;
            pbVar34[1] = 0x7f;
            pbVar34[2] = 0xfe;
            pbVar34[3] = 0xff;
            if (uVar50 < 0x8c) {
              local_508.mcp[-5] = (byte)(uVar50 - 0xc);
              pbVar34 = local_508.mcp + -5;
              bVar28 = 0x42;
            }
            else {
              *(uint *)(local_508.mcp + -8) = uVar50 - 0xc;
              pbVar34 = local_508.mcp + -8;
              bVar28 = 0x82;
            }
            pbVar34[-1] = bVar28;
            local_508.mcp = pbVar34 + -2;
            pbVar34[-2] = 199;
            if (0x7fff < uVar52) {
              bVar28 = *(byte *)((long)local_508.ir + (ulong)(ushort)uVar44 * 8 + 6);
              RVar15 = (Reg)bVar28;
              if ((char)bVar28 < '\0') {
                pcStack_530 = (code *)0x13b0df;
                RVar15 = ra_allocref(&local_508,uVar52,0xbfeb);
              }
              bVar28 = (byte)RVar15 & 0x1f;
              local_508.weakset = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
              xVar36 = XO_MOVto;
              goto LAB_0013b0fb;
            }
            uVar45 = (pIVar55->field_1).op12;
LAB_0013b236:
            local_508.mcp = pbVar34 + -6;
            *(undefined4 *)(pbVar34 + -6) = uVar45;
            if (iVar56 == 0) {
              bVar28 = 2;
            }
            else if (uVar44 < 0x12000000) {
              pbVar34[-7] = (byte)iVar56;
              local_508.mcp = pbVar34 + -7;
              bVar28 = 0x42;
            }
            else {
              *(int *)(pbVar34 + -10) = iVar56;
              local_508.mcp = pbVar34 + -10;
              bVar28 = 0x82;
            }
            local_508.mcp[-1] = bVar28;
            local_508.mcp[-2] = 199;
            local_508.mcp = local_508.mcp + -2;
LAB_0013b277:
          }
          if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
        }
        IVar57.field_0 = IVar57.field_0 + 1;
      } while (IVar32 != IVar57);
    }
    if ((local_508.parent == (GCtrace *)0x0 & (byte)local_51c) == 1) {
      pcStack_530 = (code *)0x13b35a;
      asm_stack_check(&local_508,local_508.topslot,(IRIns *)0x0,local_508.freeset & 0xbfef,
                      (ExitNo)local_518);
    }
  }
switchD_0013b3fe_caseD_c:
  do {
    local_508.curins = local_508.curins - 1;
    if (local_508.curins <= local_508.stopins) goto LAB_0013ed88;
    unaff_RBP = local_508.ir + local_508.curins;
    pcStack_530 = (code *)0x13b38f;
    asm_snap_prev(&local_508);
  } while (((((char)(unaff_RBP->field_1).r < '\0') && ((unaff_RBP->field_1).s == '\0')) &&
           ((((unaff_RBP->field_1).t.irt | 0x60) & lj_ir_mode[(unaff_RBP->field_1).o]) < 0x60)) &&
          ((local_508.flags & 0x40000) != 0));
  if ((char)(unaff_RBP->field_1).t.irt < '\0') {
    pcStack_530 = (code *)0x13b3cc;
    asm_snap_prep(&local_508);
  }
  TVar13 = local_138;
  pIVar55 = local_508.ir;
  if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
  switch((unaff_RBP->field_1).o) {
  case '\0':
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\n':
    goto switchD_0013b3fe_caseD_0;
  case '\b':
  case '\t':
    if ((*(char *)((long)unaff_RBP + -3) == ':') &&
       (local_508.curins - 1 == (uint)(unaff_RBP->field_0).op1)) {
      pIVar1 = &(unaff_RBP->field_1).o;
      unaff_RBP = unaff_RBP + -1;
      pcStack_530 = (code *)0x13b649;
      local_508.curins = local_508.curins - 1;
      asm_href(&local_508,unaff_RBP,(uint)*pIVar1);
    }
    else {
switchD_0013b3fe_caseD_0:
      pcStack_530 = (code *)0x13b40d;
      asm_comp(&local_508,unaff_RBP);
    }
    goto switchD_0013b3fe_caseD_c;
  case '\v':
    RVar15 = (Reg)*(byte *)((long)local_508.ir + 0x40006);
    if ((char)*(byte *)((long)local_508.ir + 0x40006) < '\0') {
      pcStack_530 = (code *)0x13bf63;
      RVar15 = ra_allocref(&local_508,0x8000,0xbfef);
    }
    bVar28 = (byte)RVar15 & 0x1f;
    local_508.weakset = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
    pcStack_530 = (code *)0x13bf8d;
    RVar17 = ra_scratch(&local_508,~(1 << (RVar15 & 0x1f)) & 0xbfef);
    local_528 = local_508.ir[(ulong)(unaff_RBP->field_0).op2 + 1];
    bVar28 = *(byte *)((long)local_528 + -3);
    BVar42 = local_508.topslot - (bVar28 + 2);
    BVar29 = 0;
    if (0 < (int)BVar42) {
      BVar29 = BVar42;
    }
    local_508.topslot = BVar29;
    *(byte *)((long)local_508.ir + 0x40004U) = *(byte *)((long)local_508.ir + 0x40004U) | 0x20;
    unaff_RBP = (IRIns *)(ulong)RVar17;
    pcStack_530 = (code *)0x13bff3;
    emit_rma(&local_508,XO_MOVto,RVar15 | 0x80200,local_508.J[-1].penalty + 0x3c);
    pcStack_530 = (code *)0x13c00c;
    emit_gri(&local_508,0x838100,RVar15 | 0x80200,-((uint)bVar28 * 8 + 0x10));
    pcStack_530 = (code *)0x13c019;
    asm_guardcc(&local_508,5);
    pcStack_530 = (code *)0x13c035;
    emit_rmro(&local_508,XO_CMP,RVar17 | 0x80200,RVar15,-8);
    pcStack_530 = (code *)0x13c043;
    emit_loadu64(&local_508,RVar17,(uint64_t)local_528);
  case '\f':
  case 'Z':
  case 'd':
    goto switchD_0013b3fe_caseD_c;
  default:
    ((local_508.J)->errinfo).n = (double)(unaff_RBP->field_1).o;
    pcStack_530 = (code *)0x13fa40;
    lj_trace_err_info(local_508.J,LJ_TRERR_NYIIR);
  case '\x0f':
    iVar56 = local_508.gcsteps;
    for (pIVar55 = local_508.ir + (local_508.stopins + 1); pIVar55 < unaff_RBP;
        pIVar55 = pIVar55 + 1) {
      if (((byte)((pIVar55->field_1).o + 0xaf) < 4) &&
         ((-1 < (char)(pIVar55->field_1).r || ((pIVar55->field_1).s != '\0')))) {
        iVar56 = iVar56 + 1;
        local_508.gcsteps = iVar56;
      }
    }
    if (local_508.gcsteps != 0) {
      pcStack_530 = (code *)0x13c0a6;
      asm_gc_check(&local_508);
    }
    local_508.gcsteps = -0x80000000;
    goto switchD_0013b3fe_caseD_c;
  case '\x10':
    bVar58 = true;
    bVar59 = true;
    if (*(char *)((long)unaff_RBP + -2) < '\0') {
      bVar59 = *(char *)((long)unaff_RBP + -1) != '\0';
    }
    if ((char)(unaff_RBP->field_1).r < '\0') {
      bVar58 = (unaff_RBP->field_1).s != '\0';
    }
    if ((local_508.flags & 0x40000) == 0) {
      bVar59 = true;
      bVar58 = true;
    }
    if ((((bVar58) && (uVar37 = *(byte *)((long)unaff_RBP + -3) - 0x5f, uVar37 < 5)) &&
        (uVar37 != 1)) && (!bVar59)) {
      pcStack_530 = (code *)0x13be34;
      ra_allocref(&local_508,(uint)(unaff_RBP->field_0).op1,1);
    }
    goto switchD_0013b3fe_caseD_c;
  case '\x11':
    local_508.loopsnapno = local_508.snapno;
    if (local_508.gcsteps != 0) {
      pcStack_530 = (code *)0x13c312;
      asm_gc_check(&local_508);
    }
    local_508.sectref = 0;
    local_508.invmcp = (byte *)0x0;
    local_508.flagmcp = (byte *)0x0;
    if (local_508.fuseref != 0xffffffff) {
      local_508.fuseref = 0;
    }
    while( true ) {
      if (local_508.phiset == 0) {
        RVar54 = 0;
        blocked = 0;
      }
      else {
        blocked = 0;
        RVar54 = 0;
        RVar51 = local_508.phiset;
        do {
          uVar37 = 0;
          if (RVar51 != 0) {
            for (; (RVar51 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
            }
          }
          bVar28 = *(byte *)((long)local_508.ir + (ulong)local_508.phireg[uVar37] * 8 + 6);
          uVar44 = (uint)bVar28;
          if (uVar37 != bVar28) {
            if ((local_508.freeset >> (uVar37 & 0x1f) & 1) == 0) {
              uVar5 = (ushort)local_508.cost[uVar37];
              if ((*(byte *)((long)local_508.ir + (ulong)uVar5 * 8 + 4) & 0x20) == 0) {
                pcStack_530 = (code *)0x13c3ab;
                ra_restore(&local_508,(uint)uVar5);
                if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
              }
              else {
                blocked = blocked | 1 << ((byte)uVar37 & 0x1f);
                uVar44 = 0;
                if (-1 < (char)bVar28) {
                  uVar44 = 1 << (bVar28 & 0x1f);
                }
                RVar54 = RVar54 | uVar44;
                uVar44 = 0x80;
              }
            }
            if (uVar44 < 0x80) {
              pcStack_530 = (code *)0x13c3f5;
              ra_rename(&local_508,uVar44,uVar37);
              if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
            }
          }
          bVar28 = (byte)uVar37 & 0x1f;
          RVar51 = RVar51 & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
        } while (RVar51 != 0);
      }
      if (blocked == 0) break;
      if ((local_508.freeset & blocked) == 0) {
        pcStack_530 = (code *)0x13c44d;
        asm_phi_break(&local_508,blocked,RVar54,0xbfef);
        pcStack_530 = (code *)0x13c45e;
        asm_phi_break(&local_508,blocked,RVar54,0xffff0000);
        if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
      }
    }
    uVar37 = ~(local_508.phiset | local_508.freeset) & local_508.modset & 0xffff0000;
    while (uVar37 != 0) {
      uVar44 = 0;
      if (uVar37 != 0) {
        for (; (uVar37 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
        }
      }
      pcStack_530 = (code *)0x13cb83;
      ra_restore(&local_508,(uint)(ushort)local_508.cost[uVar44]);
      uVar37 = uVar37 & ~(1 << (uVar44 & 0x1f));
      if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
    }
    uVar37 = ~(local_508.phiset | local_508.freeset) & local_508.modset;
    while (uVar37 != 0) {
      uVar44 = 0;
      if (uVar37 != 0) {
        for (; (uVar37 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
        }
      }
      pcStack_530 = (code *)0x13cbce;
      ra_restore(&local_508,(uint)(ushort)local_508.cost[uVar44]);
      uVar37 = uVar37 & ~(1 << (uVar44 & 0x1f));
      if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
    }
    pbVar34 = local_508.mcp;
    for (uVar37 = local_508.phiset; local_508.mcp = pbVar34, uVar37 != 0;
        uVar37 = uVar37 & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28)) {
      uVar52 = uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8 | uVar37 << 0x18;
      uVar44 = 0x1f;
      if (uVar52 != 0) {
        for (; uVar52 >> uVar44 == 0; uVar44 = uVar44 - 1) {
        }
      }
      uVar44 = uVar44 ^ 0x18;
      uVar5 = local_508.phireg[uVar44];
      uVar31 = (ulong)uVar5;
      if (*(char *)((long)local_508.ir + uVar31 * 8 + 7) != '\0') {
        pIVar55 = local_508.ir + uVar31;
        (pIVar55->field_1).t.irt = (pIVar55->field_1).t.irt & 0xdf;
        bVar28 = *(byte *)((long)local_508.ir + uVar31 * 8 + 6);
        if ((char)bVar28 < '\0') {
          pcStack_530 = (code *)0x13cc44;
          RVar15 = ra_allocref(&local_508,(uint)uVar5,1 << ((byte)uVar44 & 0x1f));
          bVar28 = (byte)RVar15;
        }
        local_508.weakset =
             local_508.weakset & (-2 << (bVar28 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar28 & 0x1f));
        pcStack_530 = (code *)0x13cc74;
        emit_storeofs(&local_508,pIVar55,uVar44,4,(uint)(pIVar55->field_1).s << 2);
        if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
      }
      bVar28 = (byte)uVar44 & 0x1f;
      pbVar34 = local_508.mcp;
    }
    unaff_RBP = (IRIns *)0x0;
    if (*(char *)((long)local_508.ir + (ulong)(local_508.orignins - 1) * 8 + 5) == '\x13') {
      pIVar55 = local_508.ir + (local_508.orignins - 1);
      unaff_RBP = (IRIns *)0x0;
      do {
        if (((pIVar55->field_1).s != '\0') &&
           (*(char *)((long)local_508.ir + (ulong)(pIVar55->field_0).op1 * 8 + 7) != '\0')) {
          unaff_RBP = (IRIns *)(ulong)((uint)unaff_RBP |
                                      ((byte)(((pIVar55->field_1).t.irt & 0x1f) - 0xd) < 2) + 1);
        }
        pcVar2 = (char *)((long)pIVar55 + -3);
        pIVar55 = pIVar55 + -1;
      } while (*pcVar2 == '\x13');
    }
    if (((ulong)unaff_RBP & 1) != 0) {
      if ((local_508._168_8_ & 0xbfef) == 0) {
        uVar31 = 0;
        uVar37 = -(uint)((0x605fd9U >>
                          (*(uint *)((long)local_508.ir + (ulong)(ushort)local_508.cost[0] * 8 + 4)
                          & 0x1f) & 1) != 0) & 0x80200;
        pbVar34[-1] = 0x24;
        pbVar34[-3] = 0x8b;
        pbVar34[-2] = 4;
        if ((short)uVar37 == 0) {
          local_508.mcp = pbVar34 + -3;
        }
        else {
          local_508.mcp = pbVar34 + -4;
          pbVar34[-4] = (byte)(uVar37 >> 0x10) | 0x40;
        }
      }
      else {
        uVar37 = 0;
        if ((local_508._168_8_ & 0xbfef) != 0) {
          for (; ((local_508.freeset & 0xbfef) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
          }
        }
        uVar31 = (ulong)uVar37;
      }
      uVar37 = (uint)uVar31;
      if (*(char *)((long)local_508.ir + (ulong)(local_508.orignins - 1) * 8 + 5) == '\x13') {
        pIVar55 = local_508.ir + (local_508.orignins - 1);
        do {
          if ((pIVar55->field_1).s != '\0') {
            bVar28 = *(byte *)((long)local_508.ir + (ulong)(pIVar55->field_0).op1 * 8 + 7);
            if ((bVar28 != 0) && (1 < (byte)(((pIVar55->field_1).t.irt & 0x1f) - 0xd))) {
              pcStack_530 = (code *)0x13e498;
              emit_storeofs(&local_508,local_508.ir + (pIVar55->field_0).op1,uVar37,4,
                            (uint)bVar28 << 2);
              pcStack_530 = (code *)0x13e4b3;
              emit_loadofs(&local_508,pIVar55,uVar37,4,(uint)(pIVar55->field_1).s << 2);
              if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
            }
          }
          pcVar2 = (char *)((long)pIVar55 + -3);
          pIVar55 = pIVar55 + -1;
        } while (*pcVar2 == '\x13');
      }
      if ((local_508.freeset >> (uVar37 & 0x1f) & 1) == 0) {
        pcStack_530 = (code *)0x13e507;
        emit_storeofs(&local_508,local_508.ir + (ushort)local_508.cost[uVar31],uVar37,4,0);
      }
    }
    if (((ulong)unaff_RBP & 2) != 0) {
      uVar37 = 0;
      bVar58 = (local_508._168_8_ & 0xffff0000) != 0;
      if (bVar58) {
        for (; ((local_508.freeset & 0xffff0000) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
        }
      }
      uVar31 = 0x10;
      if (bVar58) {
        uVar31 = (ulong)uVar37;
      }
      uVar37 = (uint)uVar31;
      uVar44 = 1 << ((byte)uVar31 & 0x1f);
      unaff_RBP = (IRIns *)(ulong)uVar44;
      if ((local_508.freeset >> (uVar37 & 0x1f) & 1) == 0) {
        pcStack_530 = (code *)0x13e55e;
        emit_loadofs(&local_508,local_508.ir + (ushort)local_508.cost[uVar31],uVar37,4,0);
      }
      if (*(char *)((long)local_508.ir + (ulong)(local_508.orignins - 1) * 8 + 5) == '\x13') {
        pIVar55 = local_508.ir + (local_508.orignins - 1);
        do {
          if ((pIVar55->field_1).s != '\0') {
            bVar28 = *(byte *)((long)local_508.ir + (ulong)(pIVar55->field_0).op1 * 8 + 7);
            if ((bVar28 != 0) && ((byte)(((pIVar55->field_1).t.irt & 0x1f) - 0xd) < 2)) {
              pcStack_530 = (code *)0x13e5c7;
              emit_storeofs(&local_508,local_508.ir + (pIVar55->field_0).op1,uVar37,4,
                            (uint)bVar28 << 2);
              pcStack_530 = (code *)0x13e5e2;
              emit_loadofs(&local_508,pIVar55,uVar37,4,(uint)(pIVar55->field_1).s << 2);
              if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
            }
          }
          pcVar2 = (char *)((long)pIVar55 + -3);
          pIVar55 = pIVar55 + -1;
        } while (*pcVar2 == '\x13');
      }
      if ((local_508.freeset & uVar44) == 0) {
        pcStack_530 = (code *)0x13e633;
        emit_storeofs(&local_508,local_508.ir + (ushort)local_508.cost[uVar31],uVar37,4,0);
      }
    }
    iVar56 = (int)local_508.mcp;
    if (local_508.realign == (byte *)0x0) {
      local_508.mctop[-5] = 0xe9;
      if (local_508.loopinv == 0) {
        iVar43 = iVar56 - (int)local_508.mctop;
        lVar25 = 3;
        lVar47 = -4;
        pbVar33 = local_508.mctop;
LAB_0013e6db:
        *(int *)(local_508.mctop + lVar47) = iVar43;
        pbVar22 = local_508.mcp + lVar25;
      }
      else {
        pbVar33 = local_508.mctop + -5;
        iVar43 = iVar56 - (int)pbVar33;
        *(int *)(local_508.mctop + -9) = iVar43;
        if (local_508.loopinv == 2) {
          iVar43 = iVar43 + 6;
          lVar25 = 8;
          lVar47 = -0xf;
          goto LAB_0013e6db;
        }
        pbVar22 = local_508.mcp + 4;
      }
      if (pbVar33 + -0x80 <= pbVar22) {
        local_508.realign = pbVar22;
        local_508.curins = local_508.stopins;
        (local_508.T)->nins = local_508.orignins;
      }
    }
    else {
      local_508.realign = (byte *)0x0;
      if (local_508.loopinv == 0) {
        local_508.mctop[-1] = (char)local_508.mcp - (char)local_508.mctop;
        local_508.mctop[-2] = 0xeb;
      }
      else {
        local_508.mctop[-5] = 0xe9;
        bVar28 = (char)local_508.mcp - ((char)local_508.mctop + -5);
        local_508.mctop[-6] = bVar28;
        if (local_508.loopinv == 2) {
          local_508.mctop[-8] = bVar28 + 2;
        }
      }
    }
    local_508.mcloop = local_508.mcp;
    if (local_508.mcp != pbVar34) {
      *(int *)(local_508.mcp + -4) = (int)pbVar34 - iVar56;
      local_508.mcp[-5] = 0xe9;
      local_508.mcp = local_508.mcp + -5;
      goto LAB_0013e741;
    }
    goto switchD_0013b3fe_caseD_c;
  case '\x12':
    bVar28 = *(byte *)((long)local_508.ir + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
    if ((char)bVar28 < '\0') {
      RVar54 = 0xbfef;
      if ((byte)(((unaff_RBP->field_1).t.irt & 0x1f) - 0xd) < 2) {
        RVar54 = 0xffff0000;
      }
      pcStack_530 = (code *)0x13bedb;
      RVar15 = ra_allocref(&local_508,(uint)(unaff_RBP->field_0).op1,RVar54);
      bVar28 = (byte)RVar15;
    }
    local_508.weakset =
         local_508.weakset & (-2 << (bVar28 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar28 & 0x1f));
    goto switchD_0013b3fe_caseD_c;
  case '\x13':
    uVar37 = 0xbfef;
    if ((byte)(((unaff_RBP->field_1).t.irt & 0x1f) - 0xd) < 2) {
      uVar37 = 0xffff0000;
    }
    if ((unaff_RBP->field_1).r != 0xfe) {
      uVar31 = (ulong)(unaff_RBP->field_0).op1;
      if (*(char *)((long)local_508.ir + uVar31 * 8 + 7) == '\0') {
        pIVar21 = local_508.ir + (unaff_RBP->field_0).op2;
        if ((pIVar21->field_1).s == '\0') {
          uVar37 = uVar37 & ~local_508.phiset;
          if ((local_508.freeset & uVar37 & (local_508.freeset & uVar37) - 1) != 0) {
            if ((char)(pIVar21->field_1).r < '\0') {
              pcStack_530 = (code *)0x13e2a3;
              RVar15 = ra_allocref(&local_508,(uint)(unaff_RBP->field_0).op2,uVar37);
            }
            else {
              pcStack_530 = (code *)0x13dc0e;
              RVar15 = ra_scratch(&local_508,uVar37);
              pcStack_530 = (code *)0x13dc22;
              emit_movrr(&local_508,pIVar21,RVar15,(uint)(pIVar21->field_1).r);
            }
            bVar28 = (byte)RVar15;
            (unaff_RBP->field_1).r = bVar28;
            local_508.phiset = local_508.phiset | 1 << (bVar28 & 0x1f);
            local_508.phireg[RVar15] = (unaff_RBP->field_0).op1;
            pbVar34 = (byte *)((long)pIVar55 + uVar31 * 8 + 4);
            *pbVar34 = *pbVar34 | 0x20;
            if (*(char *)((long)pIVar55 + uVar31 * 8 + 6) < '\0') {
              *(byte *)((long)pIVar55 + uVar31 * 8 + 6) = bVar28 | 0x80;
            }
            goto switchD_0013b3fe_caseD_c;
          }
          if ((*(char *)((long)local_508.ir + uVar31 * 8 + 6) < '\0') &&
             ((char)(pIVar21->field_1).r < '\0')) {
            pcStack_530 = (code *)0x13c23c;
            ra_spill(&local_508,unaff_RBP);
            (pIVar21->field_1).s = (unaff_RBP->field_1).s;
            goto switchD_0013b3fe_caseD_c;
          }
        }
      }
      pcStack_530 = (code *)0x13fa1c;
      lj_trace_err(local_508.J,LJ_TRERR_NYIPHI);
    }
    goto switchD_0013b3fe_caseD_c;
  case '\x15':
    pcStack_530 = (code *)0x13c5d3;
    asm_guardcc(&local_508,5);
    local_508.mcp[-1] = 0x80;
    addr = (void *)((long)&local_508.J[-1].penalty[0x2d].val + 1);
    xVar36 = XO_GROUP3b;
    RVar15 = 0;
    local_508.mcp = local_508.mcp + -1;
    goto LAB_0013c601;
  case '\x1f':
    pcStack_530 = (code *)0x13c1aa;
    asm_neg_not(&local_508,unaff_RBP,XOg_NOT);
    goto switchD_0013b3fe_caseD_c;
  case ' ':
    pcStack_530 = (code *)0x13be4e;
    RVar15 = ra_dest(&local_508,unaff_RBP,0xbfef);
    uVar52._0_2_ = *(IROpT *)((long)unaff_RBP + 4);
    uVar52._2_2_ = *(IRRef1 *)((long)unaff_RBP + 6);
    uVar37 = -(uint)((0x605fd9U >> (uVar52 & 0x1f) & 1) != 0) & 0x80200;
    *(Reg *)(local_508.mcp + -4) = (RVar15 & 7) << 0x18 | 0xc80f00fd;
    uVar44 = RVar15 >> 3 & 1;
    if ((uVar37 >> 1 & 0xffff) == 0 && uVar44 == 0) {
      local_508.mcp = local_508.mcp + -2;
    }
    else {
      local_508.mcp[-3] = (byte)(uVar37 >> 0x10) | (byte)uVar44 | 0x40;
      local_508.mcp = local_508.mcp + -3;
    }
    pcStack_530 = (code *)0x13d7c3;
    ra_left(&local_508,RVar15,(uint)(unaff_RBP->field_0).op1);
    goto switchD_0013b3fe_caseD_c;
  case '!':
    pcStack_530 = (code *)0x13bf35;
    asm_intarith(&local_508,unaff_RBP,XOg_AND);
    goto switchD_0013b3fe_caseD_c;
  case '\"':
    pcStack_530 = (code *)0x13c4bc;
    asm_intarith(&local_508,unaff_RBP,XOg_OR);
    goto switchD_0013b3fe_caseD_c;
  case '#':
    pcStack_530 = (code *)0x13bdbd;
    asm_intarith(&local_508,unaff_RBP,XOg_XOR);
    goto switchD_0013b3fe_caseD_c;
  case '$':
    pcStack_530 = (code *)0x13c282;
    asm_bitshift(&local_508,unaff_RBP,XOg_SHL,XV_SHLX);
    goto switchD_0013b3fe_caseD_c;
  case '%':
    pcStack_530 = (code *)0x13c193;
    asm_bitshift(&local_508,unaff_RBP,XOg_SHR,XV_SHRX);
    goto switchD_0013b3fe_caseD_c;
  case '&':
    pcStack_530 = (code *)0x13c4a5;
    asm_bitshift(&local_508,unaff_RBP,XOg_SAR,XV_SARX);
    goto switchD_0013b3fe_caseD_c;
  case '\'':
    xs = XOg_ROL;
    goto LAB_0013c4ce;
  case '(':
    xs = XOg_ROR;
LAB_0013c4ce:
    pcStack_530 = (code *)0x13c4d5;
    asm_bitshift(&local_508,unaff_RBP,xs,XOg_FADDq);
    goto switchD_0013b3fe_caseD_c;
  case ')':
    uVar37 = (unaff_RBP->field_1).t.irt & 0x1f;
    if (uVar37 != 0xe) {
      if ((local_508.flagmcp != local_508.mcp) && ((0x605fd9U >> uVar37 & 1) == 0)) {
        uVar53 = (ulong)(unaff_RBP->field_0).op1;
        uVar31 = (ulong)(unaff_RBP->field_0).op2;
        local_508.mrm.base = 0x80;
        local_508.mrm.idx = 0x80;
        local_508.mrm.scale = '\0';
        local_508.mrm.ofs = 0;
        cVar3 = *(char *)((long)local_508.ir + uVar53 * 8 + 6);
        if (cVar3 < '\0') {
          if ((((unaff_RBP->field_0).op1 != (unaff_RBP->field_0).op2) &&
              (*(char *)((long)local_508.ir + uVar53 * 8 + 5) == ')')) &&
             ((local_508.fuseref < (unaff_RBP->field_0).op1 &&
              ((-1 < (short)(unaff_RBP->field_0).op2 ||
               (-1 < *(short *)((long)local_508.ir + uVar53 * 8 + 2))))))) {
            bVar28 = *(byte *)((long)local_508.ir + (ulong)local_508.ir[uVar53].field_0.op1 * 8 + 6)
            ;
            RVar15 = (Reg)bVar28;
            if ((char)bVar28 < '\0') {
              pcStack_530 = (code *)0x13ea89;
              RVar15 = ra_allocref(&local_508,(uint)local_508.ir[uVar53].field_0.op1,0xbfef);
            }
            bVar28 = (byte)RVar15 & 0x1f;
            uVar37 = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
            uVar44 = ~(1 << (RVar15 & 0x1f)) & 0xbfef;
            local_508.mrm.base = (byte)RVar15;
            if ((short)(unaff_RBP->field_0).op2 < 0) {
              local_508.mrm.ofs =
                   local_508.ir[*(ushort *)((long)pIVar55 + uVar53 * 8 + 2)].field_1.op12;
              uVar5 = (unaff_RBP->field_0).op2;
            }
            else {
              local_508.mrm.ofs = pIVar55[uVar31].field_1.op12;
              uVar5 = *(ushort *)((long)pIVar55 + uVar53 * 8 + 2);
            }
            bVar28 = *(byte *)((long)local_508.ir + (ulong)uVar5 * 8 + 6);
            RVar15 = (Reg)bVar28;
            local_508.weakset = uVar37;
            if ((char)bVar28 < '\0') {
              pcStack_530 = (code *)0x13ed3e;
              RVar15 = ra_allocref(&local_508,(uint)uVar5,uVar44);
            }
            bVar28 = (byte)RVar15 & 0x1f;
            local_508.weakset = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
            RVar54 = uVar44 & ~(1 << (RVar15 & 0x1f));
            local_508.mrm.idx = (byte)RVar15;
            goto LAB_0013ed58;
          }
        }
        else {
          RVar54 = ~(1 << ((int)cVar3 & 0x1fU)) & 0xbfef;
          local_508.weakset = local_508.weakset & ~(1 << ((int)cVar3 & 0x1fU));
          local_508.mrm.base = *(undefined1 *)((long)local_508.ir + uVar53 * 8 + 6);
          local_508.mrm.idx = 0x80;
          uVar5 = (unaff_RBP->field_0).op2;
          if (((short)uVar5 < 0) && (*(char *)((long)local_508.ir + uVar31 * 8 + 6) < '\0')) {
            if (((*(char *)((long)local_508.ir + uVar31 * 8 + 5) == ')') &&
                (local_508.fuseref < uVar5)) &&
               (-1 < *(short *)((long)local_508.ir + uVar31 * 8 + 2))) {
              pcStack_530 = (code *)0x13ece7;
              RVar15 = ra_alloc1(&local_508,(uint)local_508.ir[uVar31].field_0.op1,RVar54);
              RVar54 = RVar54 & ~(1 << (RVar15 & 0x1f));
              local_508.mrm.idx = (char)RVar15;
              local_508.mrm.ofs =
                   local_508.ir[*(ushort *)((long)pIVar55 + uVar31 * 8 + 2)].field_1.op12;
LAB_0013ed58:
              pcStack_530 = (code *)0x13ed6a;
              RVar15 = ra_dest(&local_508,unaff_RBP,RVar54);
              xVar36 = XO_LEA;
              break;
            }
          }
          else {
            bVar28 = (unaff_RBP->field_1).r;
            if (((long)(char)bVar28 < 0) ||
               ((((*(byte *)((long)local_508.ir + uVar53 * 8 + 4) & 0x40) == 0 ||
                 (local_508.phireg[(char)bVar28] != (unaff_RBP->field_0).op1)) &&
                (((*(byte *)((long)local_508.ir + uVar31 * 8 + 4) & 0x40) == 0 ||
                 (local_508.phireg[bVar28] != uVar5)))))) {
              if ((short)uVar5 < 0) {
                uVar37 = (uint)*(byte *)((long)local_508.ir + uVar31 * 8 + 6);
                RVar54 = RVar54 & ~(1 << (uVar37 & 0x1f));
                local_508.weakset = local_508.weakset & ~(1 << (uVar37 & 0x1f));
                local_508.mrm.idx = *(undefined1 *)((long)local_508.ir + uVar31 * 8 + 6);
              }
              else {
                local_508.mrm.ofs = local_508.ir[uVar31].field_1.op12;
              }
              goto LAB_0013ed58;
            }
          }
        }
      }
      goto switchD_0013b3fe_caseD_35;
    }
    pcStack_530 = (code *)0x13c54e;
    asm_fparith(&local_508,unaff_RBP,XO_ADDSD);
    goto switchD_0013b3fe_caseD_c;
  case '*':
    if (((unaff_RBP->field_1).t.irt & 0x1f) != 0xe) goto switchD_0013b3fe_caseD_36;
    pcStack_530 = (code *)0x13c5a5;
    asm_fparith(&local_508,unaff_RBP,XO_SUBSD);
    goto switchD_0013b3fe_caseD_c;
  case '+':
    if (((unaff_RBP->field_1).t.irt & 0x1f) != 0xe) goto switchD_0013b3fe_caseD_37;
    pcStack_530 = (code *)0x13c56e;
    asm_fparith(&local_508,unaff_RBP,XO_MULSD);
    goto switchD_0013b3fe_caseD_c;
  case ',':
    bVar28 = (unaff_RBP->field_1).t.irt & 0x1f;
    if (bVar28 != 0xe) {
      id_00 = bVar28 == 0x15 ^ IRCALL_lj_carith_divu64;
      goto LAB_0013d258;
    }
    pcStack_530 = (code *)0x13c527;
    asm_fparith(&local_508,unaff_RBP,XO_DIVSD);
    goto switchD_0013b3fe_caseD_c;
  case '-':
    bVar28 = (unaff_RBP->field_1).t.irt & 0x1f;
    if (bVar28 == 0x13) {
      local_138.u64._0_6_ = CONCAT24((unaff_RBP->field_0).op2,(uint)(unaff_RBP->field_0).op1);
      pCVar35 = lj_ir_callinfo + 0x30;
LAB_0013c728:
      local_138.u64._6_2_ = 0;
      pcStack_530 = (code *)0x13c73b;
      asm_setupresult(&local_508,unaff_RBP,pCVar35);
      goto LAB_0013c741;
    }
    id_00 = bVar28 == 0x15 ^ IRCALL_lj_carith_modu64;
    goto LAB_0013d258;
  case '.':
    bVar28 = (unaff_RBP->field_1).t.irt & 0x1f;
    if (bVar28 != 0xe) {
      id_00 = bVar28 == 0x15 ^ IRCALL_lj_carith_powu64;
      goto LAB_0013d258;
    }
    if ((*(byte *)((long)local_508.ir + (ulong)(unaff_RBP->field_0).op2 * 8 + 4) & 0x1f) == 0xe) {
      local_138.u64._0_6_ = CONCAT24((unaff_RBP->field_0).op2,(uint)(unaff_RBP->field_0).op1);
      pCVar35 = lj_ir_callinfo + 0x46;
      goto LAB_0013c728;
    }
    bVar28 = (unaff_RBP->field_1).r & 0x1f;
    RVar54 = (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28) & 0x30001;
    if ((char)(unaff_RBP->field_1).r < '\0') {
      RVar54 = 0x30001;
    }
    pcStack_530 = (code *)0x13db05;
    ra_evictset(&local_508,RVar54);
    pcStack_530 = (code *)0x13db15;
    ra_destreg(&local_508,unaff_RBP,0x10);
    pcStack_530 = (code *)0x13db24;
    emit_call_(&local_508,(MCode *)lj_vm_powi_sse);
    pcStack_530 = (code *)0x13db35;
    ra_left(&local_508,0x10,(uint)(unaff_RBP->field_0).op1);
    pcStack_530 = (code *)0x13db43;
    ra_left(&local_508,0,(uint)(unaff_RBP->field_0).op2);
    goto switchD_0013b3fe_caseD_c;
  case '/':
    if (((unaff_RBP->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_530 = (code *)0x13c7b0;
      asm_fparith(&local_508,unaff_RBP,XO_XORPS);
    }
    else {
      pcStack_530 = (code *)0x13d30c;
      asm_neg_not(&local_508,unaff_RBP,XOg_NEG);
    }
    goto switchD_0013b3fe_caseD_c;
  case '0':
    pcStack_530 = (code *)0x13c489;
    asm_fparith(&local_508,unaff_RBP,XO_ANDPS);
    goto switchD_0013b3fe_caseD_c;
  case '1':
    bVar28 = (unaff_RBP->field_1).s;
    iVar56 = (uint)bVar28 * 4;
    bVar14 = (unaff_RBP->field_1).r;
    if (-1 < (char)bVar14) {
      uVar37 = 1 << (bVar14 & 0x1f);
      local_508.modset = local_508.modset | uVar37;
      local_508.freeset = local_508.freeset | uVar37;
      pcStack_530 = (code *)0x13c2c8;
      emit_rmro(&local_508,XO_MOVSD,(int)(char)bVar14,4,iVar56);
    }
    if (bVar28 == 0) {
      bVar28 = 0x1c;
    }
    else if (bVar28 < 0x20) {
      local_508.mcp[-1] = (byte)iVar56;
      local_508.mcp = local_508.mcp + -1;
      bVar28 = 0x5c;
    }
    else {
      *(int *)(local_508.mcp + -4) = iVar56;
      local_508.mcp = local_508.mcp + -4;
      bVar28 = 0x9c;
    }
    local_508.mcp[-1] = 0x24;
    local_508.mcp[-2] = bVar28;
    local_508.mcp[-3] = 0xdd;
    local_508.mcp[-5] = 0xdd;
    local_508.mcp[-4] = 0xd9;
    local_508.mcp[-7] = 0xd9;
    local_508.mcp[-6] = 0xfd;
    local_508.mcp = local_508.mcp + -7;
    pcStack_530 = (code *)0x13d89f;
    asm_x87load(&local_508,(uint)(unaff_RBP->field_0).op1);
    pcStack_530 = (code *)0x13d8ab;
    asm_x87load(&local_508,(uint)(unaff_RBP->field_0).op2);
    goto switchD_0013b3fe_caseD_c;
  case '2':
    if (((unaff_RBP->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_530 = (code *)0x13bf0f;
      asm_fparith(&local_508,unaff_RBP,XO_MINSD);
    }
    else {
      pcStack_530 = (code *)0x13d0a8;
      asm_intmin_max(&local_508,unaff_RBP,0xf);
    }
    goto switchD_0013b3fe_caseD_c;
  case '3':
    if (((unaff_RBP->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_530 = (code *)0x13c266;
      asm_fparith(&local_508,unaff_RBP,XO_MAXSD);
    }
    else {
      pcStack_530 = (code *)0x13d0b7;
      asm_intmin_max(&local_508,unaff_RBP,0xc);
    }
    goto switchD_0013b3fe_caseD_c;
  case '4':
    uVar5 = (unaff_RBP->field_0).op2;
    if (uVar5 != 3) {
      if (uVar5 < 3) {
        if ((local_508.flags & 0x20) == 0) {
          bVar28 = (unaff_RBP->field_1).r & 0x1f;
          RVar54 = (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28) & 0xf0001;
          if ((char)(unaff_RBP->field_1).r < '\0') {
            RVar54 = 0xf0001;
          }
          pcStack_530 = (code *)0x13d1fe;
          ra_evictset(&local_508,RVar54);
          pcStack_530 = (code *)0x13d20e;
          ra_destreg(&local_508,unaff_RBP,0x10);
          pcVar27 = lj_vm_trunc;
          if (uVar5 == 1) {
            pcVar27 = lj_vm_ceil;
          }
          target = lj_vm_floor;
          if (uVar5 != 0) {
            target = pcVar27;
          }
          pcStack_530 = (code *)0x13d238;
          emit_call_(&local_508,(MCode *)target);
          pcStack_530 = (code *)0x13d249;
          ra_left(&local_508,0x10,(uint)(unaff_RBP->field_0).op1);
        }
        else {
          pcStack_530 = (code *)0x13e113;
          RVar15 = ra_dest(&local_508,unaff_RBP,0xffff0000);
          pcStack_530 = (code *)0x13e127;
          RVar17 = asm_fuseload(&local_508,(uint)(unaff_RBP->field_0).op1,0xffff0000);
          local_508.mcp[-1] = (char)uVar5 + 9;
          pcStack_530 = (code *)0x13e151;
          local_508.mcp = local_508.mcp + -1;
          emit_mrm(&local_508,XO_ROUNDSD,RVar15,RVar17);
          pMVar12 = local_508.mcp;
          if (local_508.mcp[1] != 0x3a) {
            *local_508.mcp = local_508.mcp[1];
            local_508.mcp[1] = 0xf;
          }
          local_508.mcp = local_508.mcp + -1;
          pMVar12[-1] = 0x66;
        }
      }
      else {
        pcStack_530 = (code *)0x13dadd;
        asm_callid(&local_508,unaff_RBP,uVar5 + IRCALL_lj_vm_floor);
      }
      goto switchD_0013b3fe_caseD_c;
    }
    pcStack_530 = (code *)0x13c6bc;
    RVar15 = ra_dest(&local_508,unaff_RBP,0xffff0000);
    pcStack_530 = (code *)0x13c6d0;
    RVar17 = asm_fuseload(&local_508,(uint)(unaff_RBP->field_0).op1,0xffff0000);
    xVar36 = XO_SQRTSD;
    goto LAB_0013c6db;
  case '5':
switchD_0013b3fe_caseD_35:
    pcStack_530 = (code *)0x13e7e3;
    asm_intarith(&local_508,unaff_RBP,XOg_ADD);
    goto switchD_0013b3fe_caseD_c;
  case '6':
switchD_0013b3fe_caseD_36:
    pcStack_530 = (code *)0x13c5bc;
    asm_intarith(&local_508,unaff_RBP,XOg_SUB);
    goto switchD_0013b3fe_caseD_c;
  case '7':
switchD_0013b3fe_caseD_37:
    pcStack_530 = (code *)0x13c585;
    asm_intarith(&local_508,unaff_RBP,XOg_X_IMUL);
    goto switchD_0013b3fe_caseD_c;
  case '8':
    pcStack_530 = (code *)0x13bafb;
    RVar15 = ra_dest(&local_508,unaff_RBP,0xbfef);
    pcStack_530 = (code *)0x13bb0d;
    asm_fusearef(&local_508,unaff_RBP,0xbfef);
    RVar15 = RVar15 | 0x80200;
    xVar36 = XO_LEA;
    break;
  case '9':
    local_528.gcr.gcptr64._2_6_ = 0;
    local_528.field_0.op1 = local_508.ir[(unaff_RBP->field_0).op2].field_0.op1;
    uVar5 = *(ushort *)((long)local_508.ir + (ulong)(unaff_RBP->field_0).op2 * 8 + 2);
    if (((char)(unaff_RBP->field_1).r < '\0') && ((unaff_RBP->field_1).s == '\0')) {
      RVar15 = 0x80;
    }
    else {
      pcStack_530 = (code *)0x13c0f3;
      RVar15 = ra_dest(&local_508,unaff_RBP,0xbfef);
    }
    bVar28 = *(byte *)((long)local_508.ir + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
    uVar31 = (ulong)bVar28;
    if ((char)bVar28 < '\0') {
      pcStack_530 = (code *)0x13c11a;
      RVar17 = ra_allocref(&local_508,(uint)(unaff_RBP->field_0).op1,0xbfef);
      uVar31 = (ulong)RVar17;
    }
    iVar56 = (uint)uVar5 * 0x18;
    RVar17 = (Reg)uVar31;
    bVar28 = (byte)uVar31;
    local_508.weakset =
         local_508.weakset & (-2 << (bVar28 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar28 & 0x1f));
    if (RVar15 < 0x80) {
      if (uVar5 == 0) {
        if (RVar15 != RVar17) {
          local_508.mcp[-1] = (bVar28 & 7) + (char)RVar15 * '\b' | 0xc0;
          local_508.mcp[-2] = 0x8b;
          local_508.mcp[-3] = (byte)(uVar31 >> 3) & 1 | (byte)(RVar15 >> 1) & 4 | 0x48;
          local_508.mcp = local_508.mcp + -3;
        }
      }
      else if (RVar15 == RVar17) {
        pcStack_530 = (code *)0x13c177;
        emit_gri(&local_508,0x838100,RVar15 | 0x80200,iVar56);
      }
      else {
        pcStack_530 = (code *)0x13de93;
        emit_rmro(&local_508,XO_LEA,RVar15 | 0x80200,RVar17,iVar56);
      }
    }
    pcStack_530 = (code *)0x13dea2;
    asm_guardcc(&local_508,5);
    IVar32 = local_528;
    bVar14 = *(byte *)((long)pIVar55 + (long)local_528 * 8 + 4) & 0x1f;
    if (bVar14 < 3) {
      *(uint *)(local_508.mcp + -4) = (int)(char)~bVar14 << 0xf | 0x7fff;
      local_508.mcp = local_508.mcp + -4;
      unaff_RBP = (IRIns *)(ulong)(iVar56 + 0xcU);
      pcStack_530 = (code *)0x13deef;
      emit_rmro(&local_508,XO_ARITHi,7,RVar17,iVar56 + 0xcU);
    }
    else {
      pcStack_530 = (code *)0x13df0e;
      RVar15 = ra_scratch(&local_508,~(1 << (bVar28 & 0x1f)) & 0xbfef);
      unaff_RBP = (IRIns *)(ulong)(iVar56 + 8U);
      pcStack_530 = (code *)0x13df2e;
      emit_rmro(&local_508,XO_CMP,RVar15 | 0x80200,RVar17,iVar56 + 8U);
      bVar28 = *(byte *)((long)pIVar55 + (long)IVar32 * 8 + 4) & 0x1f;
      if (bVar28 == 0xe) {
        IVar32 = pIVar55[(long)IVar32 + 1];
      }
      else {
        IVar32.field_0 = (long)(char)~bVar28 << 0x2f | pIVar55[(long)IVar32 + 1];
      }
      pcStack_530 = (code *)0x13df5c;
      emit_loadu64(&local_508,RVar15,(uint64_t)IVar32);
    }
    goto switchD_0013b3fe_caseD_c;
  case ':':
    pcStack_530 = (code *)0x13c7c4;
    asm_href(&local_508,unaff_RBP,IR_LT);
    goto switchD_0013b3fe_caseD_c;
  case ';':
    if ((unaff_RBP->field_1).r != 0xfe) {
      pcStack_530 = (code *)0x13ba47;
      asm_snap_prep(&local_508);
      local_138.u64._4_2_ = (unaff_RBP->field_0).op1;
      local_138.field_4.i = 0x7fff;
      local_138.u64._6_2_ = 0;
      local_130 = 0x7ffd;
      pcStack_530 = (code *)0x13ba7b;
      asm_setupresult(&local_508,unaff_RBP,lj_ir_callinfo + 0x23);
      pcStack_530 = (code *)0x13ba89;
      asm_gencall(&local_508,lj_ir_callinfo + 0x23,(IRRef *)&local_138.u64);
      RVar15 = (Reg)*(byte *)((long)local_508.ir + 0x3ffee);
      uVar37 = 1 << (*(byte *)((long)local_508.ir + 0x3ffee) & 0x1f);
      local_508.modset = local_508.modset | uVar37;
      local_508.freeset = local_508.freeset | uVar37;
      *(undefined1 *)((long)local_508.ir + 0x3ffee) = 0xff;
      IVar30 = (IRRef)(unaff_RBP->field_0).op2;
      goto LAB_0013d2f1;
    }
    goto switchD_0013b3fe_caseD_c;
  case '<':
  case '=':
    pcStack_530 = (code *)0x13b525;
    RVar15 = ra_dest(&local_508,unaff_RBP,0xbfef);
    if ((long)(short)(unaff_RBP->field_0).op1 < 0) {
      pcStack_530 = (code *)0x13ce34;
      RVar17 = ra_scratch(&local_508,0xbfef);
      bVar28 = *(byte *)((long)local_508.ir + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
      rb = (Reg)bVar28;
      if ((char)bVar28 < '\0') {
        pcStack_530 = (code *)0x13ce5b;
        rb = ra_allocref(&local_508,(uint)(unaff_RBP->field_0).op1,0xbfef);
      }
      bVar28 = (byte)rb & 0x1f;
      local_508.weakset = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
      RVar15 = RVar15 | 0x80200;
      if ((unaff_RBP->field_1).o == '=') {
        pcStack_530 = (code *)0x13ce9d;
        emit_rmro(&local_508,XO_LEA,RVar15,RVar17,0x10);
        pcStack_530 = (code *)0x13ceaa;
        asm_guardcc(&local_508,5);
        local_508.mcp[-1] = 1;
        xVar36 = XO_ARITHib;
        RVar15 = 7;
        iVar46 = 10;
        local_508.mcp = local_508.mcp + -1;
      }
      else {
        xVar36 = XO_MOV;
        iVar46 = 0x20;
      }
      pcStack_530 = (code *)0x13d596;
      emit_rmro(&local_508,xVar36,RVar15,RVar17,iVar46);
      pcStack_530 = (code *)0x13d5bc;
      emit_rmro(&local_508,XO_MOV,RVar17 | 0x80200,rb,
                (uint)*(byte *)((long)&(unaff_RBP->field_0).op2 + 1) * 8 + 0x28);
    }
    else {
      addr = (void *)(*(long *)((long)local_508.ir[(long)(short)(unaff_RBP->field_0).op1 + 1] + 0x28
                               + (ulong)*(byte *)((long)&(unaff_RBP->field_0).op2 + 1) * 8) + 0x20);
      RVar15 = RVar15 | 0x80200;
      xVar36 = XO_MOV;
LAB_0013c601:
      pcStack_530 = (code *)0x13c606;
      emit_rma(&local_508,xVar36,RVar15,addr);
    }
    goto switchD_0013b3fe_caseD_c;
  case '>':
    pcStack_530 = (code *)0x13c677;
    RVar15 = ra_dest(&local_508,unaff_RBP,0xbfef);
    pcStack_530 = (code *)0x13c68a;
    asm_fusefref(&local_508,unaff_RBP,0xbfef);
    xVar36 = XO_LEA;
    break;
  case '?':
    pcStack_530 = (code *)0x13bcc8;
    RVar15 = ra_dest(&local_508,unaff_RBP,0xbfef);
    pcStack_530 = (code *)0x13bcda;
    asm_tvptr(&local_508,RVar15,(uint)(unaff_RBP->field_0).op1,(uint)(unaff_RBP->field_0).op2);
    goto switchD_0013b3fe_caseD_c;
  case '@':
    pcStack_530 = (code *)0x13bc2f;
    RVar15 = ra_dest(&local_508,unaff_RBP,0xbfef);
    local_508.mrm.base = 0x80;
    local_508.mrm.idx = 0x80;
    local_508.mrm.scale = '\0';
    local_508.mrm.ofs = 0x18;
    bVar28 = *(byte *)((long)local_508.ir + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
    if ((char)bVar28 < '\0') {
      pcStack_530 = (code *)0x13bc71;
      RVar17 = ra_allocref(&local_508,(uint)(unaff_RBP->field_0).op1,0xbfef);
      bVar28 = (byte)RVar17;
    }
    local_508.weakset =
         local_508.weakset & (-2 << (bVar28 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar28 & 0x1f));
    local_508.mrm.base = bVar28;
    uVar5 = (unaff_RBP->field_0).op2;
    if ((short)uVar5 < 0) {
      bVar14 = *(byte *)((long)local_508.ir + (ulong)uVar5 * 8 + 6);
      if ((char)bVar14 < '\0') {
        pcStack_530 = (code *)0x13d6cd;
        RVar17 = ra_allocref(&local_508,(uint)uVar5,~(1 << (bVar28 & 0x1f)) & 0xbfef);
        bVar14 = (byte)RVar17;
      }
      local_508.weakset =
           local_508.weakset & (-2 << (bVar14 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar14 & 0x1f));
      local_508.mrm.idx = bVar14;
    }
    else {
      local_508.mrm.ofs = local_508.mrm.ofs + local_508.ir[uVar5].field_1.op12;
    }
    if (local_508.mrm.base == 0x80) {
      pcStack_530 = (code *)0x13dcd4;
      emit_loadi(&local_508,RVar15,local_508.mrm.ofs);
      goto switchD_0013b3fe_caseD_c;
    }
    RVar15 = RVar15 | 0x80200;
    xVar36 = XO_LEA;
    break;
  case 'A':
    pcStack_530 = (code *)0x13bad2;
    RVar15 = ra_dest(&local_508,unaff_RBP,0xbfef);
    pcStack_530 = (code *)0x13bae1;
    ra_left(&local_508,RVar15,0x7fff);
    goto switchD_0013b3fe_caseD_c;
  case 'B':
  case 'C':
  case 'D':
  case 'H':
    if (((char)(unaff_RBP->field_1).r < '\0') && ((unaff_RBP->field_1).s == '\0')) {
      if (((unaff_RBP->field_1).t.irt & 0x1f) - 3 < 10) {
        pcStack_530 = (code *)0x13cfdf;
        RVar15 = ra_scratch(&local_508,0xbfef);
        uVar31 = (ulong)RVar15;
        RVar54 = ~(1 << (RVar15 & 0x1f)) & 0xbfef;
      }
      else {
        RVar54 = 0xbfef;
        uVar31 = 0x80;
      }
      pcStack_530 = (code *)0x13d8cc;
      asm_fuseahuref(&local_508,(uint)(unaff_RBP->field_0).op1,RVar54);
      if ((unaff_RBP->field_1).o == 'H') {
        local_508.mrm.ofs = local_508.mrm.ofs + (uint)(unaff_RBP->field_0).op2 * 8;
      }
    }
    else {
      RVar54 = 0xffff0000;
      if (((unaff_RBP->field_1).t.irt & 0x1f) != 0xe) {
        RVar54 = 0xbfef;
      }
      pcStack_530 = (code *)0x13b446;
      RVar15 = ra_dest(&local_508,unaff_RBP,RVar54);
      pcStack_530 = (code *)0x13b459;
      asm_fuseahuref(&local_508,(uint)(unaff_RBP->field_0).op1,0xbfef);
      if ((unaff_RBP->field_1).o == 'H') {
        local_508.mrm.ofs = local_508.mrm.ofs + (uint)(unaff_RBP->field_0).op2 * 8;
      }
      uVar37 = ((unaff_RBP->field_1).t.irt & 0x1f) - 0xd;
      if (uVar37 < 0xfffffff6) {
        xVar36 = XO_MOVSD;
        if (RVar15 < 0x10) {
          xVar36 = XO_MOV;
        }
      }
      else {
        local_508.mcp[-1] = 0x11;
        bVar28 = (byte)RVar15 & 7;
        local_508.mcp[-2] = bVar28 - 0x18;
        local_508.mcp[-3] = 0xc1;
        uVar44 = RVar15 >> 3 & 1;
        iVar56 = uVar44 + 0x48;
        local_528.field_1.op12 = iVar56;
        local_508.mcp[-4] = (byte)iVar56;
        local_508.mcp = local_508.mcp + -4;
        pcStack_530 = (code *)0x13b712;
        asm_guardcc(&local_508,5);
        local_508.mcp[-1] = ~(unaff_RBP->field_1).t.irt | 0xe0;
        local_508.mcp[-2] = (byte)RVar15 | 0xf8;
        local_508.mcp[-3] = 0x83;
        lVar25 = -2;
        if (uVar44 != 0) {
          local_508.mcp[-4] = 0x41;
          lVar25 = -3;
        }
        local_508.mcp[lVar25 + -2] = 0x66;
        local_508.mcp[lVar25 + -3] = 0x2f;
        if ((local_508.flags & 0x40) == 0) {
          local_508.mcp[lVar25 + -4] = bVar28 | 200;
          local_508.mcp[lVar25 + -5] = 0xc1;
          local_508.mcp[lVar25 + -6] = (byte)local_528.field_0.op1;
          RVar15 = RVar15 | 0x80200;
          xVar36 = XO_MOV;
          local_508.mcp = local_508.mcp + lVar25 + -6;
        }
        else {
          xVar36 = 0xf0fbe3c4;
          local_508.mcp = local_508.mcp + lVar25 + -3;
        }
      }
      pcStack_530 = (code *)0x13cd23;
      emit_mrm(&local_508,xVar36,RVar15,0x20);
      uVar31 = 0x80;
      if (0xfffffff5 < uVar37) goto switchD_0013b3fe_caseD_c;
    }
    local_508.mrm.ofs = local_508.mrm.ofs + 4;
    pcStack_530 = (code *)0x13cd56;
    asm_guardcc(&local_508,(uint)(((unaff_RBP->field_1).t.irt & 0x1f) != 0xe) * 2 + 3);
    uVar37 = (unaff_RBP->field_1).t.irt & 0x1f;
    if ((byte)uVar37 < 0xe) {
      if (uVar37 - 3 < 10) {
        local_508.mrm.ofs = local_508.mrm.ofs - 4;
        local_508.mcp[-1] = ~(unaff_RBP->field_1).t.irt | 0xe0;
        pcStack_530 = (code *)0x13cdcd;
        local_508.mcp = local_508.mcp + -1;
        emit_mrm(&local_508,XO_ARITHi8,7,(uint)uVar31);
        local_508.mcp[-1] = 0x2f;
        local_508.mcp[-2] = (byte)uVar31 | 0xf8;
        local_508.mcp[-3] = 0xc1;
        local_508.mcp[-4] = (byte)(uVar31 >> 3) & 1 | 0x48;
        RVar15 = (uint)uVar31 | 0x80200;
        xVar36 = XO_MOV;
LAB_0013dd8c:
        local_508.mcp = local_508.mcp + -4;
      }
      else {
        if ((byte)uVar37 != 0) {
          *(uint *)(local_508.mcp + -4) = ~uVar37 << 0xf | 0x7fff;
          goto LAB_0013cfa8;
        }
        local_508.mrm.ofs = local_508.mrm.ofs - 4;
        local_508.mcp[-1] = 0xff;
        xVar36 = XO_ARITHi8;
        RVar15 = 0x80207;
        local_508.mcp = local_508.mcp + -1;
      }
    }
    else {
      pbVar34 = local_508.mcp + -4;
      pbVar34[0] = 0;
      pbVar34[1] = 0;
      pbVar34[2] = 0xf9;
      pbVar34[3] = 0xff;
LAB_0013cfa8:
      local_508.mcp = local_508.mcp + -4;
      xVar36 = XO_ARITHi;
      RVar15 = 7;
    }
    break;
  case 'E':
  case 'F':
    pcStack_530 = (code *)0x13b6ab;
    asm_fxload(&local_508,unaff_RBP);
    goto switchD_0013b3fe_caseD_c;
  case 'G':
    uVar5 = (unaff_RBP->field_0).op1;
    uVar45 = (uint)uVar5 * 8 + -0x10;
    bVar28 = (byte)(unaff_RBP->field_0).ot;
    if (((bVar28 & 0x9f) == 0x93 & (byte)(unaff_RBP->field_0).op2 >> 3) == 1) {
      pcStack_530 = (code *)0x13ca3a;
      RVar17 = ra_scratch(&local_508,0xffff0000);
      pcStack_530 = (code *)0x13ca4a;
      asm_tointg(&local_508,unaff_RBP,RVar17);
      RVar15 = (Reg)*(byte *)((long)local_508.ir + 0x40006);
      if ((char)*(byte *)((long)local_508.ir + 0x40006) < '\0') {
        pcStack_530 = (code *)0x13ca70;
        RVar15 = ra_allocref(&local_508,0x8000,0xbfef);
      }
      bVar28 = (byte)RVar15 & 0x1f;
      local_508.weakset = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
      pcStack_530 = (code *)0x13ca98;
      emit_rmro(&local_508,XO_MOVSD,RVar17,RVar15,uVar45);
      bVar28 = 0xe;
    }
    else if (((char)(unaff_RBP->field_1).r < '\0') && ((unaff_RBP->field_1).s == '\0')) {
      if (((unaff_RBP->field_0).op2 & 4) == 0) goto switchD_0013b3fe_caseD_c;
      RVar15 = (Reg)*(byte *)((long)local_508.ir + 0x40006);
      if ((char)*(byte *)((long)local_508.ir + 0x40006) < '\0') {
        pcStack_530 = (code *)0x13e77d;
        RVar15 = ra_allocref(&local_508,0x8000,0xbfef);
      }
      bVar14 = (byte)RVar15 & 0x1f;
      local_508.weakset = local_508.weakset & (-2 << bVar14 | 0xfffffffeU >> 0x20 - bVar14);
    }
    else {
      local_528.i = uVar45;
      bVar14 = (byte)(bVar28 & 0x1f);
      RVar54 = 0xbfef;
      if (bVar14 == 0xe) {
        RVar54 = 0xffff0000;
      }
      pcStack_530 = (code *)0x13d3d4;
      RVar17 = ra_dest(&local_508,unaff_RBP,RVar54);
      RVar15 = (Reg)*(byte *)((long)local_508.ir + 0x40006);
      if ((char)*(byte *)((long)local_508.ir + 0x40006) < '\0') {
        pcStack_530 = (code *)0x13d3fd;
        RVar15 = ra_allocref(&local_508,0x8000,0xbfef);
      }
      bVar40 = (byte)RVar15 & 0x1f;
      local_508.weakset = local_508.weakset & (-2 << bVar40 | 0xfffffffeU >> 0x20 - bVar40);
      if (((unaff_RBP->field_0).op2 & 8) == 0) {
        if (9 < (bVar28 & 0x1f) - 3) {
          xVar36 = XO_MOV;
          if (bVar14 == 0xe) {
            xVar36 = XO_MOVSD;
          }
          goto LAB_0013e200;
        }
        local_508.mcp[-1] = 0x11;
        uVar31 = (ulong)RVar17 & 0xffffffffffffff07;
        local_508.mcp[-2] = (char)uVar31 - 0x18;
        local_508.mcp[-3] = 0xc1;
        uVar37 = RVar17 >> 3 & 1;
        iVar56 = uVar37 + 0x48;
        local_508.mcp[-4] = (byte)iVar56;
        local_508.mcp = local_508.mcp + -4;
        local_51c = RVar17;
        if (((unaff_RBP->field_0).op2 & 4) != 0) {
          local_510 = (IRIns *)CONCAT44(local_510._4_4_,iVar56);
          pcStack_530 = (code *)0x13d49a;
          local_518 = uVar31;
          asm_guardcc(&local_508,5);
          local_508.mcp[-1] = ~bVar14;
          local_508.mcp[-2] = (byte)local_51c | 0xf8;
          local_508.mcp[-3] = 0x83;
          lVar25 = -2;
          if (uVar37 != 0) {
            local_508.mcp[-4] = 0x41;
            lVar25 = -3;
          }
          local_508.mcp = local_508.mcp + lVar25 + -2;
          *local_508.mcp = 0x66;
          uVar31 = local_518;
          iVar56 = (int)local_510;
        }
        if ((local_508.flags & 0x40) == 0) {
          bVar58 = ((unaff_RBP->field_0).op2 & 4) == 0;
          bVar14 = 0x2f;
          if (bVar58) {
            bVar14 = 0x11;
          }
          bVar40 = 200;
          if (bVar58) {
            bVar40 = 0xe0;
          }
          local_508.mcp[-1] = bVar14;
          local_508.mcp[-2] = (byte)uVar31 | bVar40;
          local_508.mcp[-3] = 0xc1;
          local_508.mcp[-4] = (byte)iVar56;
          xVar36 = XO_MOV;
          uVar37 = local_51c | 0x80200;
          local_508.mcp = local_508.mcp + -4;
        }
        else {
          local_508.mcp[-1] = 0x2f;
          xVar36 = 0xf0fbe3c4;
          uVar37 = local_51c;
          local_508.mcp = local_508.mcp + -1;
        }
        uVar45 = local_528._0_4_;
        pcStack_530 = (code *)0x13e81a;
        emit_rmro(&local_508,xVar36,uVar37,RVar15,local_528._0_4_);
        bVar58 = false;
      }
      else {
        bVar28 = (bVar14 != 0x13) * '\x05' + 0xe;
        xVar36 = (uint)(bVar14 == 0x13) * 0x2000000 + XO_CVTSI2SD;
LAB_0013e200:
        uVar45 = local_528._0_4_;
        pcStack_530 = (code *)0x13e216;
        emit_rmro(&local_508,xVar36,RVar17,RVar15,local_528._0_4_);
        bVar58 = true;
      }
      if (!bVar58) goto switchD_0013b3fe_caseD_c;
    }
    if (((unaff_RBP->field_0).op2 & 4) != 0) {
      bVar28 = bVar28 & 0x1f;
      pcStack_530 = (code *)0x13e850;
      asm_guardcc(&local_508,(uint)(bVar28 != 0xe) * 2 + 3);
      if (bVar28 < 0xe) {
        if (bVar28 == 0) {
          local_508.mcp[-1] = 0xff;
          xVar36 = XO_ARITHi8;
          uVar37 = 0x80207;
          local_508.mcp = local_508.mcp + -1;
        }
        else {
          if (bVar28 < 3) {
            *(uint *)(local_508.mcp + -4) = (int)(char)~bVar28 << 0xf | 0x7fff;
            goto LAB_0013e8aa;
          }
          pcStack_530 = (code *)0x13e906;
          RVar17 = ra_scratch(&local_508,~(1 << (RVar15 & 0x1f)) & 0xbfef);
          local_508.mcp[-1] = ~bVar28;
          bVar28 = (byte)RVar17 | 0xf8;
          local_508.mcp[-2] = bVar28;
          local_508.mcp[-3] = 0x83;
          lVar25 = -2;
          uVar37 = RVar17 >> 3 & 1;
          if (uVar37 != 0) {
            local_508.mcp[-4] = 0x41;
            lVar25 = -3;
          }
          local_508.mcp[lVar25 + -2] = 0x2f;
          local_508.mcp[lVar25 + -3] = bVar28;
          local_508.mcp[lVar25 + -4] = 0xc1;
          local_508.mcp[lVar25 + -5] = (byte)uVar37 | 0x48;
          uVar37 = RVar17 | 0x80200;
          xVar36 = XO_MOV;
          local_508.mcp = local_508.mcp + lVar25 + -5;
        }
        pcStack_530 = (code *)0x13e998;
        emit_rmro(&local_508,xVar36,uVar37,RVar15,uVar45);
      }
      else {
        pbVar34 = local_508.mcp + -4;
        pbVar34[0] = 0;
        pbVar34[1] = 0;
        pbVar34[2] = 0xf9;
        pbVar34[3] = 0xff;
LAB_0013e8aa:
        local_508.mcp = local_508.mcp + -4;
        pcStack_530 = (code *)0x13e8c2;
        emit_rmro(&local_508,XO_ARITHi,7,RVar15,(uint)uVar5 * 8 + -0xc);
      }
    }
    goto switchD_0013b3fe_caseD_c;
  case 'I':
    id_00 = (uint)((unaff_RBP->field_0).op2 != 0x7fff) * 5 + IRCALL_lj_tab_len;
LAB_0013d258:
    pcStack_530 = (code *)0x13d265;
    asm_callid(&local_508,unaff_RBP,id_00);
    goto switchD_0013b3fe_caseD_c;
  case 'J':
  case 'K':
  case 'L':
    if ((unaff_RBP->field_1).r == 0xfe) goto switchD_0013b3fe_caseD_c;
    uVar5 = (unaff_RBP->field_0).op2;
    uVar31 = (ulong)uVar5;
    if (((unaff_RBP->field_1).t.irt & 0x1f) == 0xe) {
      bVar28 = *(byte *)((long)local_508.ir + uVar31 * 8 + 6);
      RVar15 = (Reg)bVar28;
      if ((char)bVar28 < '\0') {
        pcStack_530 = (code *)0x13b4dd;
        RVar15 = ra_allocref(&local_508,(uint)uVar5,0xffff0000);
      }
      bVar28 = (byte)RVar15 & 0x1f;
      local_508.weakset = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
      pcStack_530 = (code *)0x13b506;
      asm_fuseahuref(&local_508,(uint)(unaff_RBP->field_0).op1,0xbfef);
      xVar36 = XO_MOVSDto;
    }
    else {
      if (-1 < (short)uVar5) {
        pcStack_530 = (code *)0x13cf16;
        lj_ir_kvalue((local_508.J)->L,&local_138,
                     (IRIns *)((ulong)((uint)uVar5 * 8) + (long)local_508.ir));
        pcStack_530 = (code *)0x13cf27;
        asm_fuseahuref(&local_508,(uint)(unaff_RBP->field_0).op1,0xbfef);
        if (local_138.u64 == 0xffffffffffffffff) {
          RVar15 = 0x80200;
          uVar45 = 0xffffffff;
        }
        else {
          *(int32_t *)(local_508.mcp + -4) = local_138.field_4.i;
          local_508.mcp = local_508.mcp + -4;
          RVar15 = 0;
          pcStack_530 = (code *)0x13cf68;
          emit_mrm(&local_508,XO_MOVmi,0,0x20);
          local_508.mrm.ofs = local_508.mrm.ofs + 4;
          uVar45 = local_138.field_4.it;
        }
        *(undefined4 *)(local_508.mcp + -4) = uVar45;
        xVar36 = XO_MOVmi;
        goto LAB_0013dd8c;
      }
      bVar28 = *(byte *)((long)local_508.ir + uVar31 * 8 + 6);
      RVar15 = (Reg)bVar28;
      if ((char)bVar28 < '\0') {
        pcStack_530 = (code *)0x13d90d;
        RVar15 = ra_allocref(&local_508,(uint)uVar5,0xbfef);
      }
      bVar28 = (byte)RVar15 & 0x1f;
      local_508.weakset = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
      pcStack_530 = (code *)0x13d937;
      asm_fuseahuref(&local_508,(uint)(unaff_RBP->field_0).op1,~(1 << (RVar15 & 0x1f)) & 0xbfef);
      if (RVar15 < 0x80) {
        local_508.mrm.ofs = local_508.mrm.ofs + 4;
        *(int *)(local_508.mcp + -4) = (int)(char)(~(unaff_RBP->field_1).t.irt | 0xe0) << 0xf;
        local_508.mcp = local_508.mcp + -4;
        pcStack_530 = (code *)0x13d986;
        emit_mrm(&local_508,XO_ARITHi,1,0x20);
        local_508.mrm.ofs = local_508.mrm.ofs - 4;
        RVar15 = RVar15 | 0x80200;
        xVar36 = XO_MOVto;
      }
      else {
        if (2 < (*(byte *)((long)pIVar55 + uVar31 * 8 + 4) & 0x1f)) {
          *(IRRef2 *)(local_508.mcp + -4) = pIVar55[uVar31].field_1.op12;
          local_508.mcp = local_508.mcp + -4;
          pcStack_530 = (code *)0x13e081;
          emit_mrm(&local_508,XO_MOVmi,0,0x20);
        }
        local_508.mrm.ofs = local_508.mrm.ofs + 4;
        pbVar34 = local_508.mcp + -4;
        pbVar34[0] = 0;
        pbVar34[1] = 0;
        pbVar34[2] = 0xf9;
        pbVar34[3] = 0xff;
        xVar36 = XO_MOVmi;
        RVar15 = 0;
        local_508.mcp = local_508.mcp + -4;
      }
    }
    break;
  case 'M':
  case 'N':
    pcStack_530 = (code *)0x13b699;
    asm_fxstore(&local_508,unaff_RBP);
    goto switchD_0013b3fe_caseD_c;
  case 'O':
  case 'P':
    pcStack_530 = (code *)0x13b65b;
    asm_snap_prep(&local_508);
    local_138.u64._4_2_ = (unaff_RBP->field_0).op1;
    local_130 = (uint32_t)(unaff_RBP->field_0).op2;
    local_508.gcsteps = local_508.gcsteps + 1;
    pCVar35 = lj_ir_callinfo + 2;
    goto LAB_0013c8a2;
  case 'Q':
    pcStack_530 = (code *)0x13bd30;
    asm_snap_prep(&local_508);
    local_138.n = 6.95271921071662e-310;
    local_508.gcsteps = local_508.gcsteps + 1;
    pcStack_530 = (code *)0x13bd60;
    asm_setupresult(&local_508,unaff_RBP,lj_ir_callinfo + 0x20);
    pcStack_530 = (code *)0x13bd6e;
    asm_gencall(&local_508,lj_ir_callinfo + 0x20,(IRRef *)&local_138.u64);
    bVar28 = *(byte *)((long)local_508.ir + 0x3ffee);
    uVar37 = 1 << (bVar28 & 0x1f);
    local_508.modset = local_508.modset | uVar37;
    local_508.freeset = local_508.freeset | uVar37;
    *(undefined1 *)((long)local_508.ir + 0x3ffee) = 0xff;
    uVar37 = (uint)(unaff_RBP->field_0).op2 << 0x18 | (uint)(unaff_RBP->field_0).op1;
    goto LAB_0013e03b;
  case 'R':
    pcStack_530 = (code *)0x13c87e;
    asm_snap_prep(&local_508);
    local_138.u64._4_2_ = (unaff_RBP->field_0).op1;
    local_508.gcsteps = local_508.gcsteps + 1;
    pCVar35 = lj_ir_callinfo + 0x21;
LAB_0013c8a2:
    local_138.field_4.i = 0x7fff;
    local_138.u64._6_2_ = 0;
    pcStack_530 = (code *)0x13c8b0;
    asm_setupresult(&local_508,unaff_RBP,pCVar35);
    pcStack_530 = (code *)0x13c8be;
    asm_gencall(&local_508,pCVar35,(IRRef *)&local_138.u64);
    goto switchD_0013b3fe_caseD_c;
  case 'S':
  case 'T':
    id = local_508.ir[(unaff_RBP->field_0).op1].field_1.op12;
    pcStack_530 = (code *)0x13b598;
    CVar16 = lj_ctype_info(*(CTState **)&local_508.J[-1].penalty[0x3c].val,id,(CTSize *)&local_150.i
                          );
    local_508.gcsteps = local_508.gcsteps + 1;
    pcStack_530 = (code *)0x13b5b4;
    asm_setupresult(&local_508,unaff_RBP,lj_ir_callinfo + 0x2e);
    if ((unaff_RBP->field_1).o == 'T') {
      uVar37 = 0x80200;
      if (local_150.field_1.op12 != 8) {
        uVar37 = 0;
      }
      uVar5 = (unaff_RBP->field_0).op2;
      uVar31 = (ulong)uVar5;
      bVar28 = (byte)(uVar37 >> 0x10);
      if ((short)uVar5 < 0) {
        bVar14 = *(byte *)((long)local_508.ir + uVar31 * 8 + 6);
        RVar15 = (Reg)bVar14;
        if ((char)bVar14 < '\0') {
          pcStack_530 = (code *)0x13d5d9;
          RVar15 = ra_allocref(&local_508,(uint)uVar5,0xb028);
        }
        bVar14 = (byte)RVar15 & 0x1f;
        local_508.weakset = local_508.weakset & (-2 << bVar14 | 0xfffffffeU >> 0x20 - bVar14);
        local_508.mcp[-1] = 0x10;
        local_508.mcp[-2] = (byte)RVar15 * '\b' & 0x38 | 0x40;
        local_508.mcp[-3] = 0x89;
        uVar37 = (RVar15 | uVar37) >> 1 & 0x104;
        if (uVar37 == 0) {
          local_508.mcp = local_508.mcp + -3;
        }
        else {
          local_508.mcp[-4] = (byte)uVar37 | bVar28 | 0x40;
          local_508.mcp = local_508.mcp + -4;
        }
      }
      else {
        uVar44 = (uint)*(byte *)((long)local_508.ir + uVar31 * 8 + 5);
        if ((uVar44 < 0x1e) && ((0x26000000U >> (uVar44 & 0x1f) & 1) != 0)) {
          u64 = local_508.ir[uVar31 + 1];
        }
        else {
          u64.gcr.gcptr64._4_4_ = 0;
          u64.field_1.op12 = local_508.ir[uVar31].field_1.op12;
        }
        if ((local_150.field_1.op12 == 4) || ((long)u64 + 0x80000000U >> 0x20 == 0)) {
          *(int32_t *)(local_508.mcp + -4) = u64.i;
          local_508.mcp[-5] = 0x10;
          (local_508.mcp + -7)[0] = 199;
          (local_508.mcp + -7)[1] = 0x40;
          if ((uVar37 >> 9 & 1) == 0) {
            local_508.mcp = local_508.mcp + -7;
          }
          else {
            local_508.mcp[-8] = bVar28 | 0x40;
            local_508.mcp = local_508.mcp + -8;
          }
        }
        else {
          local_508.mcp[-1] = 0x10;
          (local_508.mcp + -3)[0] = 0x89;
          (local_508.mcp + -3)[1] = 0x48;
          if ((uVar37 >> 9 & 1) == 0) {
            local_508.mcp = local_508.mcp + -3;
          }
          else {
            local_508.mcp[-4] = bVar28 | 0x40;
            local_508.mcp = local_508.mcp + -4;
          }
          pcStack_530 = (code *)0x13de7f;
          emit_loadu64(&local_508,1,(uint64_t)u64);
        }
      }
    }
    else if ((unaff_RBP->field_0).op2 != 0x7fff) {
      local_138.u64._4_2_ = (unaff_RBP->field_0).op1;
      local_138.field_4.i = 0x7fff;
      local_138.u64._6_2_ = 0;
      local_12c = 0x7ffd;
      pcStack_530 = (code *)0x13b80a;
      local_130 = (uint)(unaff_RBP->field_0).op2;
      asm_gencall(&local_508,lj_ir_callinfo + 0x6a,(IRRef *)&local_138.u64);
      bVar28 = *(byte *)((long)local_508.ir + 0x3ffee);
      uVar37 = 1 << (bVar28 & 0x1f);
      local_508.modset = local_508.modset | uVar37;
      local_508.freeset = local_508.freeset | uVar37;
      *(undefined1 *)((long)local_508.ir + 0x3ffee) = 0xff;
      pcStack_530 = (code *)0x13b847;
      emit_loadi(&local_508,(uint)bVar28,CVar16 >> 0x10 & 0xf);
      goto switchD_0013b3fe_caseD_c;
    }
    local_508.mcp[-1] = 8;
    (local_508.mcp + -3)[0] = 0x89;
    (local_508.mcp + -3)[1] = 0x48;
    *(CTypeID *)(local_508.mcp + -7) = id << 0x10 | 0xa00;
    (local_508.mcp + -9)[0] = 0x81;
    (local_508.mcp + -9)[1] = 0xc9;
    local_508.mcp[-10] = 3;
    (local_508.mcp + -0xc)[0] = 0x83;
    (local_508.mcp + -0xc)[1] = 0xe1;
    local_508.mcp = local_508.mcp + -0xc;
    pcStack_530 = (code *)0x13dfe5;
    emit_rma(&local_508,XO_MOVZXb,1,&local_508.J[-1].penalty[0x26].val);
    local_138.n = 6.95271921071662e-310;
    pcStack_530 = (code *)0x13e009;
    asm_gencall(&local_508,lj_ir_callinfo + 0x2e,(IRRef *)&local_138.u64);
    bVar28 = *(byte *)((long)local_508.ir + 0x3ffee);
    uVar37 = 1 << (bVar28 & 0x1f);
    local_508.modset = local_508.modset | uVar37;
    local_508.freeset = local_508.freeset | uVar37;
    *(undefined1 *)((long)local_508.ir + 0x3ffee) = 0xff;
    uVar37 = local_150.field_1.op12 + 0x10;
LAB_0013e03b:
    pcStack_530 = (code *)0x13e042;
    emit_loadi(&local_508,(uint)bVar28,uVar37);
    goto switchD_0013b3fe_caseD_c;
  case 'U':
    pcStack_530 = (code *)0x13b9c0;
    RVar15 = ra_dest(&local_508,unaff_RBP,0xbfef);
    IVar41 = (unaff_RBP->field_0).op2;
    if (IVar41 == 2) {
      pcStack_530 = (code *)0x13da43;
      RVar17 = ra_scratch(&local_508,~(1 << (RVar15 & 0x1f)) & 0xbfef);
      local_138.u64._4_2_ = 9;
      pcStack_530 = (code *)0x13da66;
      emit_storeofs(&local_508,(IRIns *)&local_138,RVar17,RVar15,0x18);
      pcStack_530 = (code *)0x13da8a;
      emit_rma(&local_508,XO_OR,RVar17 | 0x80200,&local_508.J[-1].penalty[0x3b].val);
      local_508.mcp[-1] = 7;
      local_508.mcp[-2] = (byte)RVar17 & 7 | 0xe0;
      local_508.mcp[-3] = 0x83;
      if ((RVar17 & 8) == 0) {
        local_508.mcp = local_508.mcp + -3;
      }
      else {
        local_508.mcp[-4] = 0x41;
        local_508.mcp = local_508.mcp + -4;
      }
      iVar46 = 0x18;
LAB_0013e0e4:
      pcStack_530 = (code *)0x13e0e9;
      emit_loadofs(&local_508,(IRIns *)&local_138,RVar17,RVar15,iVar46);
    }
    else if (IVar41 == 1) {
      uVar5 = (unaff_RBP->field_0).op1;
      if (((*(char *)((long)local_508.ir + (ulong)uVar5 * 8 + 6) < '\0') &&
          (pIVar55 = local_508.ir + uVar5, pIVar55 != unaff_RBP + -1)) &&
         ((pIVar55 != unaff_RBP + -2 ||
          ((-1 < *(char *)((long)unaff_RBP + -2) || (*(char *)((long)unaff_RBP + -1) != '\0')))))) {
        for (; ((pIVar55->field_1).o != 'U' || ((pIVar55->field_0).op2 != 0));
            pIVar55 = local_508.ir + (pIVar55->field_0).op1) {
        }
        if (-1 < (short)(pIVar55->field_0).op1) {
          pcStack_530 = (code *)0x13da17;
          RVar17 = ra_allocref(&local_508,(uint)uVar5,0xbfef);
          local_508.weakset = local_508.weakset | 1 << ((byte)RVar17 & 0x1f);
          unaff_RBP = pIVar55;
        }
      }
    }
    else if (IVar41 == 0) {
      pcStack_530 = (code *)0x13b9f5;
      RVar17 = ra_scratch(&local_508,~(1 << (RVar15 & 0x1f)) & 0xbfef);
      local_138.u64._4_2_ = 9;
      pcStack_530 = (code *)0x13ba1a;
      emit_storeofs(&local_508,(IRIns *)&local_138,RVar17,RVar15,0);
      iVar46 = 0x10;
      goto LAB_0013e0e4;
    }
    pcStack_530 = (code *)0x13e0f9;
    ra_left(&local_508,RVar15,(uint)(unaff_RBP->field_0).op1);
    goto switchD_0013b3fe_caseD_c;
  case 'V':
    local_138.field_4.i = CONCAT22(0,(unaff_RBP->field_0).op1);
    local_138.u64._4_2_ = (unaff_RBP->field_0).op2;
    uVar31 = (ulong)(ushort)local_138.u64._4_2_;
    local_138.u64._6_2_ = 0;
    cVar3 = *(char *)((long)local_508.ir + uVar31 * 8 + 5);
    pCVar35 = lj_ir_callinfo + 0x11;
    local_528 = (int32_t)local_508.ir;
    if (cVar3 == '\x18') {
      iVar56 = -0x81;
      if (*(int *)((long)local_508.ir[uVar31 + 1] + 0x14) == 1) {
        iVar56 = (int)*(char *)((long)local_508.ir[uVar31 + 1] + 0x18);
        local_138.field_4.it = 0x7ffd;
        pCVar35 = lj_ir_callinfo + 0x12;
      }
    }
    else {
      iVar56 = -0x81;
      if ((local_508.fuseref < (ushort)local_138.u64._4_2_) &&
         (*(char *)((long)local_508.ir + uVar31 * 8 + 6) < '\0')) {
        if (cVar3 == 'O') {
          local_138.u64._4_2_ = local_508.ir[uVar31].field_0.op1;
          local_138.u64._6_2_ = 0;
          local_130 = (uint32_t)*(ushort *)((long)local_508.ir + uVar31 * 8 + 2);
          pCVar35 = lj_ir_callinfo + 0x10;
        }
        else if (cVar3 == ']') {
          sVar6 = *(short *)((long)local_508.ir + uVar31 * 8 + 2);
          if (sVar6 == 1) {
            local_138.field_4.it = 0x7ffd;
            pCVar35 = lj_ir_callinfo + 8;
          }
          else {
            local_138.u64._4_2_ = local_508.ir[uVar31].field_0.op1;
            local_138.u64._6_2_ = 0;
            pCVar35 = lj_ir_callinfo + 0x12;
            if (sVar6 == 0) {
              pCVar35 = lj_ir_callinfo + 7;
            }
          }
        }
      }
    }
    pcStack_530 = (code *)0x13d02f;
    asm_setupresult(&local_508,unaff_RBP,pCVar35);
    pcStack_530 = (code *)0x13d045;
    asm_gencall(&local_508,pCVar35,(IRRef *)&local_138.u64);
    if (local_138.field_4.it == 0x7ffd) {
      bVar28 = *(byte *)((long)local_508.ir + 0x3ffee);
      RVar15 = (Reg)bVar28;
      uVar37 = 1 << (bVar28 & 0x1f);
      local_508.modset = local_508.modset | uVar37;
      local_508.freeset = local_508.freeset | uVar37;
      *(undefined1 *)((long)local_508.ir + 0x3ffee) = 0xff;
      if (iVar56 == -0x81) {
        IVar30 = (IRRef)*(ushort *)((long)local_528 + uVar31 * 8);
        goto LAB_0013d2f1;
      }
      pcStack_530 = (code *)0x13dac6;
      emit_loadi(&local_508,(uint)bVar28,iVar56);
    }
    goto switchD_0013b3fe_caseD_c;
  case 'W':
    local_138.u64._2_2_ = 0;
    local_138.u64._0_2_ = (unaff_RBP->field_0).op1;
    local_138.field_4.it = TVar13.field_4.it;
    local_508.gcsteps = local_508.gcsteps + 1;
    pcStack_530 = (code *)0x13bc0f;
    asm_setupresult(&local_508,unaff_RBP,lj_ir_callinfo + 0x1e);
    pCVar35 = lj_ir_callinfo + 0x1e;
LAB_0013c741:
    pcStack_530 = (code *)0x13c749;
    asm_gencall(&local_508,pCVar35,(IRRef *)&local_138.u64);
    goto switchD_0013b3fe_caseD_c;
  case 'X':
    bVar28 = *(byte *)((long)local_508.ir + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
    RVar15 = (Reg)bVar28;
    if ((char)bVar28 < '\0') {
      pcStack_530 = (code *)0x13c8fd;
      RVar15 = ra_allocref(&local_508,(uint)(unaff_RBP->field_0).op1,0xbfef);
    }
    bVar28 = (byte)RVar15 & 0x1f;
    local_508.weakset = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
    pcStack_530 = (code *)0x13c924;
    RVar17 = ra_scratch(&local_508,~(1 << (RVar15 & 0x1f)) & 0xbfef);
    pMVar12 = local_508.mcp;
    uVar37 = RVar17 | 0x80200;
    unaff_RBP = (IRIns *)(ulong)uVar37;
    pcStack_530 = (code *)0x13c94d;
    emit_rmro(&local_508,XO_MOVto,uVar37,RVar15,0x18);
    pcStack_530 = (code *)0x13c971;
    emit_rma(&local_508,XO_MOVto,RVar15 | 0x80200,&local_508.J[-1].penalty[0x28].val);
    pcStack_530 = (code *)0x13c98a;
    emit_rma(&local_508,XO_MOV,uVar37,&local_508.J[-1].penalty[0x28].val);
    local_508.mcp[-1] = 0xfb;
    pcStack_530 = (code *)0x13c9ba;
    local_508.mcp = local_508.mcp + -1;
    emit_rmro(&local_508,XO_ARITHib,4,RVar15,8);
    local_508.mcp[-1] = (char)pMVar12 - (char)local_508.mcp;
    local_508.mcp[-2] = 0x74;
    local_508.mcp[-3] = 4;
    pcStack_530 = (code *)0x13c9f2;
    local_508.mcp = local_508.mcp + -3;
    emit_rmro(&local_508,XO_GROUP3b,0,RVar15,8);
    goto switchD_0013b3fe_caseD_c;
  case 'Y':
    pcStack_530 = (code *)0x13b85e;
    ra_evictset(&local_508,0xffff0fc7);
    pMVar12 = local_508.mcp;
    local_138.u64._4_2_ = (unaff_RBP->field_0).op1;
    local_138.field_4.i = 0x7ffd;
    local_138.u64._6_2_ = 0;
    pcStack_530 = (code *)0x13b889;
    asm_gencall(&local_508,lj_ir_callinfo + 0x2d,(IRRef *)&local_138.u64);
    bVar28 = *(byte *)((long)local_508.ir + 0x3ffee);
    uVar37 = 1 << (bVar28 & 0x1f);
    local_508.modset = local_508.modset | uVar37;
    local_508.freeset = local_508.freeset | uVar37;
    *(undefined1 *)((long)local_508.ir + 0x3ffee) = 0xff;
    pcStack_530 = (code *)0x13b8cb;
    emit_loadu64(&local_508,(uint)bVar28,(uint64_t)&local_508.J[-1].penalty[0x24].val);
    bVar28 = *(byte *)((long)local_508.ir + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
    local_508.mcp[-1] = (char)pMVar12 - (char)local_508.mcp;
    local_508.mcp[-2] = 0x74;
    pbVar34 = local_508.mcp + -3;
    local_508.mcp[-3] = 3;
    uVar5 = (unaff_RBP->field_0).op2;
    local_508.mcp = pbVar34;
    if ((short)uVar5 < 0) {
      bVar14 = *(byte *)((long)local_508.ir + (ulong)uVar5 * 8 + 6);
      RVar15 = (Reg)bVar14;
      if ((char)bVar14 < '\0') {
        pcStack_530 = (code *)0x13d64d;
        RVar15 = ra_allocref(&local_508,(uint)uVar5,~(1 << (bVar28 & 0x1f)) & 0xfc7);
      }
      bVar14 = (byte)RVar15 & 0x1f;
      local_508.weakset = local_508.weakset & (-2 << bVar14 | 0xfffffffeU >> 0x20 - bVar14);
      pcStack_530 = (code *)0x13d673;
      emit_rmro(&local_508,XO_GROUP3b,0,RVar15,8);
    }
    else {
      pcStack_530 = (code *)0x13b92b;
      emit_rma(&local_508,XO_GROUP3b,0,(void *)((long)local_508.ir[(ulong)uVar5 + 1] + 8));
    }
    local_508.mcp[-1] = (char)pMVar12 - (char)local_508.mcp;
    local_508.mcp[-2] = 0x74;
    local_508.mcp[-3] = 4;
    pcStack_530 = (code *)0x13d6ad;
    local_508.mcp = local_508.mcp + -3;
    emit_rmro(&local_508,XO_GROUP3b,0,(uint)bVar28,-8);
    goto switchD_0013b3fe_caseD_c;
  case '[':
    uVar44 = (unaff_RBP->field_0).op2 & 0x1f;
    uVar7 = (ushort)uVar44;
    bVar58 = (ushort)(uVar7 - 0x15) < 2;
    uVar5 = (unaff_RBP->field_0).op1;
    IVar57.gcr.gcptr64._2_6_ = 0;
    IVar57.field_0.op1 = uVar5;
    bVar28 = (byte)(unaff_RBP->field_0).ot;
    uVar37 = bVar28 & 0x1f;
    if ((byte)((char)uVar37 - 0xdU) < 2) {
      pcStack_530 = (code *)0x13c81b;
      local_528 = IVar57;
      RVar15 = ra_dest(&local_508,unaff_RBP,0xffff0000);
      IVar30 = local_528.field_1.op12;
      if ((ushort)(uVar7 - 0xd) < 2) {
        pcStack_530 = (code *)0x13c849;
        RVar17 = asm_fuseload(&local_508,IVar30,0xffff0000);
        xVar36 = (uint)(uVar7 != 0xe) << 8 | XO_CVTSD2SS;
        unaff_RBP = (IRIns *)(ulong)xVar36;
        pcStack_530 = (code *)0x13c863;
        emit_mrm(&local_508,xVar36,RVar15,RVar17);
        if (RVar17 == RVar15) goto switchD_0013b3fe_caseD_c;
      }
      else {
        uVar37 = (uint)(uVar44 == 9 || bVar58);
        if ((uVar44 | 2) == 0x16) {
          bVar28 = *(byte *)((long)local_508.ir + (long)local_528 * 8 + 6);
          RVar17 = (Reg)bVar28;
          if ((char)bVar28 < '\0') {
            pcStack_530 = (code *)0x13db84;
            RVar17 = ra_allocref(&local_508,IVar30,0xbfef);
          }
          bVar28 = (byte)RVar17 & 0x1f;
          local_508.weakset = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
        }
        else {
          pcStack_530 = (code *)0x13e2fc;
          RVar17 = asm_fuseloadm(&local_508,IVar30,0xbfef,uVar37);
        }
        pMVar12 = local_508.mcp;
        if (uVar7 == 0x16) {
          pcStack_530 = (code *)0x13e32e;
          emit_rma(&local_508,XO_ADDSD,RVar15,(local_508.J)->k64 + 1);
          local_508.mcp[-1] = (char)pMVar12 - (char)local_508.mcp;
          local_508.mcp[-2] = 0x79;
          local_508.mcp[-3] = ((byte)RVar17 & 7) + (byte)RVar17 * '\b' | 0xc0;
          local_508.mcp[-4] = 0x85;
          local_508.mcp[-5] =
               (byte)(RVar17 >> 0x10) | (byte)(RVar17 >> 1) & 4 | (byte)(RVar17 >> 3) & 1 | 0x48;
          local_508.mcp = local_508.mcp + -5;
        }
        if (uVar44 == 9 || bVar58) {
          uVar37 = 0x80200;
        }
        if (uVar7 == 0x14) {
          uVar37 = 0x80200;
        }
        pcStack_530 = (code *)0x13e3d3;
        emit_mrm(&local_508,(uint)(((unaff_RBP->field_1).t.irt & 0x1f) != 0xe) << 8 | XO_CVTSI2SD,
                 uVar37 | RVar15,RVar17);
      }
      local_508.mcp[-1] = ((byte)RVar15 & 7) + (byte)RVar15 * '\b' | 0xc0;
      (local_508.mcp + -3)[0] = 0xf;
      (local_508.mcp + -3)[1] = 0x57;
      uVar37 = RVar15 >> 3 & 1 | RVar15 >> 1 & 4;
      if (uVar37 == 0) {
        local_508.mcp = local_508.mcp + -3;
      }
      else {
        local_508.mcp[-4] = (byte)uVar37 | 0x40;
        local_508.mcp = local_508.mcp + -4;
      }
LAB_0013e741:
      goto switchD_0013b3fe_caseD_c;
    }
    if ((ushort)(uVar7 - 0xd) < 2) {
      if ((char)bVar28 < '\0') {
        bVar28 = *(byte *)((long)local_508.ir + (long)IVar57 * 8 + 6);
        RVar15 = (Reg)bVar28;
        if ((char)bVar28 < '\0') {
          pcStack_530 = (code *)0x13e276;
          RVar15 = ra_allocref(&local_508,(uint)uVar5,0xffff0000);
        }
        bVar28 = (byte)RVar15 & 0x1f;
        local_508.weakset = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
        pcStack_530 = (code *)0x13e294;
        asm_tointg(&local_508,unaff_RBP,RVar15);
        goto switchD_0013b3fe_caseD_c;
      }
      pcStack_530 = (code *)0x13d344;
      local_528 = IVar57;
      RVar15 = ra_dest(&local_508,unaff_RBP,0xbfef);
      xVar36 = (uint)(uVar7 != 0xe) << 8 | XO_CVTTSD2SI;
      bVar14 = (unaff_RBP->field_1).t.irt & 0x1f;
      bVar28 = (byte)RVar15;
      if (bVar14 == 0x14) {
        local_508.mcp[-1] = (bVar28 & 7) + bVar28 * '\b' | 0xc0;
        local_508.mcp[-2] = 0x8b;
        uVar37 = RVar15 >> 3 & 1 | RVar15 >> 1 & 4;
        if (uVar37 == 0) {
          local_508.mcp = local_508.mcp + -2;
        }
        else {
          local_508.mcp[-3] = (byte)uVar37 | 0x40;
          local_508.mcp = local_508.mcp + -3;
        }
      }
      else if (bVar14 == 0x16) {
        if (*(char *)((long)local_508.ir + (long)local_528 * 8 + 6) < '\0') {
          bVar14 = *(byte *)((long)local_508.ir + ((ulong)local_528 & 0xffffffff) * 8 + 6);
          RVar17 = (Reg)bVar14;
          if ((char)bVar14 < '\0') {
            pcStack_530 = (code *)0x13eb14;
            RVar17 = ra_allocref(&local_508,local_528.field_1.op12,0xffff0000);
          }
          bVar14 = (byte)RVar17 & 0x1f;
          local_508.weakset = local_508.weakset & (-2 << bVar14 | 0xfffffffeU >> 0x20 - bVar14);
        }
        else {
          pcStack_530 = (code *)0x13d38f;
          RVar17 = ra_scratch(&local_508,0xffff0000);
        }
        pMVar12 = local_508.mcp;
        uVar37 = RVar15 | 0x80200;
        unaff_RBP = (IRIns *)(ulong)uVar37;
        pcStack_530 = (code *)0x13eb49;
        emit_rr(&local_508,xVar36,uVar37,RVar17);
        lVar25 = 0x104;
        if (uVar7 == 0xe) {
          lVar25 = 0x140;
        }
        pcStack_530 = (code *)0x13eb83;
        emit_rma(&local_508,(uint)(uVar7 != 0xe) << 8 | XO_ADDSD,RVar17,
                 (void *)((long)&((local_508.J)->cur).nextgc.gcptr64 + lVar25));
        local_508.mcp[-1] = (char)pMVar12 - (char)local_508.mcp;
        local_508.mcp[-2] = 0x79;
        local_508.mcp[-3] = (bVar28 & 7) + bVar28 * '\b' | 0xc0;
        local_508.mcp[-4] = 0x85;
        local_508.mcp[-5] = (byte)(RVar15 >> 3) & 1 | (byte)(RVar15 >> 1) & 4 | 0x48;
        local_508.mcp = local_508.mcp + -5;
        pcStack_530 = (code *)0x13ebec;
        emit_rr(&local_508,xVar36,uVar37,RVar17);
        pcStack_530 = (code *)0x13ebfb;
        ra_left(&local_508,RVar17,local_528.i);
        goto switchD_0013b3fe_caseD_c;
      }
      uVar37._0_2_ = *(IROpT *)((long)unaff_RBP + 4);
      uVar37._2_2_ = *(IRRef1 *)((long)unaff_RBP + 6);
      uVar44 = 0;
      if (((byte)(undefined2)uVar37 & 0x1f) == 0x14) {
        uVar44 = 0x80200;
      }
      if ((0x605fd9U >> (uVar37 & 0x1f) & 1) != 0) {
        uVar44 = 0x80200;
      }
      RVar15 = uVar44 | RVar15;
      unaff_RBP = (IRIns *)(ulong)RVar15;
      pcStack_530 = (code *)0x13ec45;
      RVar17 = asm_fuseload(&local_508,local_528.field_1.op12,0xffff0000);
    }
    else if ((ushort)(uVar7 - 0xf) < 4) {
      pcStack_530 = (code *)0x13dbc4;
      RVar15 = ra_dest(&local_508,unaff_RBP,0xbfef);
      if (uVar7 == 0x11) {
        unaff_RBP = (IRIns *)0xbf0f00fd;
      }
      else if (uVar44 == 0x10) {
        RVar15 = RVar15 | 0x200;
        unaff_RBP = (IRIns *)0xb60f00fd;
      }
      else if (uVar44 == 0xf) {
        RVar15 = RVar15 | 0x200;
        unaff_RBP = (IRIns *)0xbe0f00fd;
      }
      else {
        unaff_RBP = (IRIns *)0xb70f00fd;
      }
      xVar36 = (x86Op)unaff_RBP;
      pcStack_530 = (code *)0x13ea34;
      RVar17 = asm_fuseload(&local_508,(uint)uVar5,0xbfef);
    }
    else {
      pcStack_530 = (code *)0x13e198;
      RVar15 = ra_dest(&local_508,unaff_RBP,0xbfef);
      if ((0x605fd9U >> uVar37 & 1) == 0) {
        if (((uVar7 < 0x17) && ((0x600200U >> uVar44 & 1) != 0)) &&
           (((unaff_RBP->field_0).op2 & 0x1000) == 0)) {
          pcStack_530 = (code *)0x13e1e2;
          RVar17 = asm_fuseload(&local_508,(uint)uVar5,0xbfef);
          xVar36 = XO_MOV;
          goto LAB_0013c6db;
        }
LAB_0013e7ae:
        pcStack_530 = (code *)0x13e7be;
        ra_left(&local_508,RVar15,(uint)uVar5);
        goto switchD_0013b3fe_caseD_c;
      }
      if (((uVar7 < 0x17) && ((0x600200U >> uVar44 & 1) != 0)) ||
         (((unaff_RBP->field_0).op2 & 0x800) == 0)) goto LAB_0013e7ae;
      pcStack_530 = (code *)0x13ec96;
      RVar17 = asm_fuseload(&local_508,(uint)uVar5,0xbfef);
      RVar15 = RVar15 | 0x80200;
      xVar36 = XO_MOVSXd;
    }
LAB_0013c6db:
    pcStack_530 = (code *)0x13c6e2;
    emit_mrm(&local_508,xVar36,RVar15,RVar17);
    goto switchD_0013b3fe_caseD_c;
  case '\\':
    pcStack_530 = (code *)0x13bcf4;
    RVar15 = ra_dest(&local_508,unaff_RBP,0xbfef);
    if (*(char *)((long)local_508.ir + (ulong)(unaff_RBP->field_0).op1 * 8 + 6) < '\0') {
      pcStack_530 = (code *)0x13d70a;
      uVar37 = ra_allocref(&local_508,(uint)(unaff_RBP->field_0).op1,0xffff0000);
      bVar28 = (byte)uVar37 & 0x1f;
      local_508.weakset = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
    }
    else {
      pcStack_530 = (code *)0x13bd1c;
      uVar37 = ra_scratch(&local_508,0xffff0000);
    }
    local_508.mcp[-1] = ((byte)RVar15 & 7) + (char)uVar37 * '\b' | 0xc0;
    pbVar34 = local_508.mcp + -5;
    pbVar34[0] = 0xfc;
    pbVar34[1] = 0x66;
    pbVar34[2] = 0xf;
    pbVar34[3] = 0x7e;
    uVar44 = RVar15 >> 3 & 1 | uVar37 >> 1 & 4;
    if (uVar44 == 0) {
      local_508.mcp = local_508.mcp + -4;
    }
    else {
      local_508.mcp[-4] = (byte)uVar44 | 0x40;
      local_508.mcp[-5] = 0x66;
      local_508.mcp = local_508.mcp + -5;
    }
    pcStack_530 = (code *)0x13d784;
    RVar15 = asm_fuseload(&local_508,(uint)(unaff_RBP->field_0).op2,
                          ~(1 << (uVar37 & 0x1f)) & 0xffff0000);
    pcStack_530 = (code *)0x13d795;
    emit_mrm(&local_508,XO_ADDSD,uVar37,RVar15);
    pcStack_530 = (code *)0x13d7a3;
    ra_left(&local_508,uVar37,(uint)(unaff_RBP->field_0).op1);
    goto switchD_0013b3fe_caseD_c;
  case ']':
    pcStack_530 = (code *)0x13c75b;
    asm_snap_prep(&local_508);
    local_508.gcsteps = local_508.gcsteps + 1;
    if ((unaff_RBP->field_0).op2 == 1) {
      local_138.n = 6.95271921071662e-310;
      pCVar35 = lj_ir_callinfo + 5;
    }
    else {
      local_138.u64._4_2_ = (unaff_RBP->field_0).op1;
      local_138.field_4.i = 0x7fff;
      local_138.u64._6_2_ = 0;
      pCVar35 = lj_ir_callinfo + (ulong)((unaff_RBP->field_0).op2 != 0) * 2 + 4;
    }
    pcStack_530 = (code *)0x13d2a2;
    asm_setupresult(&local_508,unaff_RBP,pCVar35);
    pcStack_530 = (code *)0x13d2b5;
    asm_gencall(&local_508,pCVar35,(IRRef *)&local_138.u64);
    if ((unaff_RBP->field_0).op2 == 1) {
      RVar15 = (Reg)*(byte *)((long)local_508.ir + 0x3ffee);
      uVar37 = 1 << (*(byte *)((long)local_508.ir + 0x3ffee) & 0x1f);
      local_508.modset = local_508.modset | uVar37;
      local_508.freeset = local_508.freeset | uVar37;
      *(undefined1 *)((long)local_508.ir + 0x3ffee) = 0xff;
      IVar30 = (IRRef)(unaff_RBP->field_0).op1;
LAB_0013d2f1:
      pcStack_530 = (code *)0x13d2fd;
      asm_tvptr(&local_508,RVar15,IVar30,1);
    }
    goto switchD_0013b3fe_caseD_c;
  case '^':
    pcStack_530 = (code *)0x13cab2;
    ra_evictset(&local_508,0xffff0fc7);
    pcStack_530 = (code *)0x13cabf;
    asm_guardcc(&local_508,4);
    (local_508.mcp + -2)[0] = 0x85;
    (local_508.mcp + -2)[1] = 0xc0;
    local_508.mcp = local_508.mcp + -2;
    local_138.u64._2_2_ = 0;
    local_138.u64._0_2_ = (unaff_RBP->field_0).op1;
    local_138.field_4.it = 0x7ffd;
    pcStack_530 = (code *)0x13cafb;
    asm_gencall(&local_508,lj_ir_callinfo + 3,(IRRef *)&local_138.u64);
    bVar28 = *(byte *)((long)local_508.ir + 0x3ffee);
    uVar37 = 1 << (bVar28 & 0x1f);
    local_508.modset = local_508.modset | uVar37;
    local_508.freeset = local_508.freeset | uVar37;
    *(undefined1 *)((long)local_508.ir + 0x3ffee) = 0xff;
    pcStack_530 = (code *)0x13cb46;
    emit_rmro(&local_508,XO_LEA,bVar28 | 0x80200,4,(uint)(unaff_RBP->field_1).s << 2);
    goto switchD_0013b3fe_caseD_c;
  case '_':
  case 'a':
  case 'b':
    goto switchD_0013b3fe_caseD_5f;
  case '`':
    local_508.gcsteps = local_508.gcsteps + 1;
switchD_0013b3fe_caseD_5f:
    pCVar35 = lj_ir_callinfo + (unaff_RBP->field_0).op2;
    pcStack_530 = (code *)0x13c641;
    asm_collectargs(&local_508,unaff_RBP,pCVar35,(IRRef *)&local_138.u64);
    pcStack_530 = (code *)0x13c64f;
    asm_setupresult(&local_508,unaff_RBP,pCVar35);
    pcStack_530 = (code *)0x13c65d;
    asm_gencall(&local_508,pCVar35,(IRRef *)&local_138.u64);
    goto switchD_0013b3fe_caseD_c;
  case 'c':
    pcStack_530 = (code *)0x13b940;
    local_148 = asm_callx_flags(&local_508,unaff_RBP);
    pcStack_530 = (code *)0x13b962;
    asm_collectargs(&local_508,unaff_RBP,(CCallInfo *)&local_150.field_0,(IRRef *)&local_138.u64);
    pcStack_530 = (code *)0x13b970;
    asm_setupresult(&local_508,unaff_RBP,(CCallInfo *)&local_150.field_0);
    uVar31 = (ulong)(unaff_RBP->field_0).op2;
    pIVar55 = local_508.ir + uVar31;
    if ((pIVar55->field_1).o == 'd') {
      uVar31 = (ulong)(pIVar55->field_0).op1;
      pIVar55 = local_508.ir + uVar31;
    }
    if ((short)uVar31 < 0) {
LAB_0013d7e4:
      local_150 = (IRIns)0x0;
    }
    else {
      if ((pIVar55->field_1).o == '\x1d') {
        local_150 = pIVar55[1];
      }
      else {
        local_150.gcr.gcptr64._4_4_ = 0;
        local_150.field_1.op12 = (pIVar55->field_1).op12;
      }
      if ((long)(int)((long)local_150 - (long)local_508.mcp) !=
          (long)local_150 - (long)local_508.mcp) goto LAB_0013d7e4;
    }
    if (local_150 == (IRIns)0x0) {
      bVar28 = *(byte *)((long)local_508.ir + uVar31 * 8 + 6);
      RVar15 = (Reg)bVar28;
      if ((char)bVar28 < '\0') {
        pcStack_530 = (code *)0x13d814;
        RVar15 = ra_allocref(&local_508,(IRRef)uVar31,0xb028);
      }
      bVar28 = (byte)RVar15 & 0x1f;
      local_508.weakset = local_508.weakset & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
      local_508.mcp[-1] = (byte)RVar15 & 7 | 0xd0;
      local_508.mcp[-2] = 0xff;
      if ((RVar15 & 8) == 0) {
        local_508.mcp = local_508.mcp + -2;
      }
      else {
        local_508.mcp[-3] = 0x41;
        local_508.mcp = local_508.mcp + -3;
      }
    }
    pcStack_530 = (code *)0x13dca7;
    asm_gencall(&local_508,(CCallInfo *)&local_150.field_0,(IRRef *)&local_138.u64);
    goto switchD_0013b3fe_caseD_c;
  }
  pcStack_530 = (code *)0x13dd98;
  emit_mrm(&local_508,xVar36,RVar15,0x20);
  goto switchD_0013b3fe_caseD_c;
switchD_0013aa49_caseD_5f:
  uVar5 = (pIVar55->field_0).op2;
  pcStack_530 = (code *)0x13ab16;
  RVar15 = asm_setup_call_slots(&local_508,pIVar55,lj_ir_callinfo + uVar5);
  (pIVar55->field_0).prev = (IRRef1)RVar15;
  if (bVar58) {
    local_508.modset =
         local_508.modset |
         (uint)((*(byte *)((long)&lj_ir_callinfo[uVar5].flags + 1) & 4) >> 2) * 0x10000 - 0xf039;
  }
LAB_0013aca3:
  pIVar55 = pIVar55 + 1;
  if (pIVar21 <= pIVar55) goto LAB_0013acb0;
  goto LAB_0013aa0a;
LAB_0013ed88:
  if ((local_508.realign != (byte *)0x0) &&
     (J = local_160, local_158->nins <= local_160->curfinal->nins)) goto LAB_0013a764;
  if (local_508.mcp < local_508.mclim) {
LAB_0013f81a:
    pcStack_530 = (code *)0x13f824;
    asm_mclimit(&local_508);
  }
  if (0 < local_508.gcsteps) {
    local_508.curins = (IRRef)(local_508.T)->snap->ref;
    pcStack_530 = (code *)0x13edfe;
    asm_snap_prep(&local_508);
    pcStack_530 = (code *)0x13ee06;
    asm_gc_check(&local_508);
    local_508.curins = local_508.stopins;
  }
  if (local_508.freeset < 0xffff0000) {
    uVar37 = ~local_508.freeset & 0xffff0000;
    do {
      uVar44 = 0;
      if (uVar37 != 0) {
        for (; (uVar37 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
        }
      }
      uVar52 = (uint)(ushort)local_508.cost[uVar44];
      if (uVar52 < 0x8000) {
        pcStack_530 = (code *)0x13ee45;
        ra_rematk(&local_508,uVar52);
        if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
      }
      bVar28 = (byte)uVar44 & 0x1f;
      uVar37 = uVar37 & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
    } while (uVar37 != 0);
  }
  if ((local_508.freeset & 0xbfef) != 0xbfef) {
    uVar37 = local_508.freeset & 0xbfef ^ 0xbfef;
    do {
      uVar44 = 0;
      if (uVar37 != 0) {
        for (; (uVar37 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
        }
      }
      uVar52 = (uint)(ushort)local_508.cost[uVar44];
      if (uVar52 < 0x8000) {
        pcStack_530 = (code *)0x13ee9a;
        ra_rematk(&local_508,uVar52);
        if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
      }
      bVar28 = (byte)uVar44 & 0x1f;
      uVar37 = uVar37 & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
    } while (uVar37 != 0);
  }
  if (local_508.parent == (GCtrace *)0x0) {
    bVar28 = *(byte *)((long)local_508.ir + 0x40006);
    if (-1 < (char)bVar28) {
      local_508.freeset = local_508.freeset | 1 << (bVar28 & 0x1f);
      if (((local_508.modset >> ((int)(char)bVar28 & 0x1fU) & 1) != 0) ||
         ((*(byte *)((long)local_508.ir + 0x40004) & 0x20) != 0)) {
        *(undefined1 *)((long)local_508.ir + 0x40006) = 0xff;
      }
      if (bVar28 != 2) {
        local_508.mcp[-1] = bVar28 * '\b' | 0xc2;
        local_508.mcp[-2] = 0x8b;
        local_508.mcp[-3] = bVar28 >> 1 & 4 | 0x48;
        local_508.mcp = local_508.mcp + -3;
      }
    }
    *(uint *)(local_508.mcp + -4) = (uint)(local_508.T)->traceno;
    local_508.mcp = local_508.mcp + -4;
    pcStack_530 = (code *)0x13f013;
    emit_rma(&local_508,XO_MOVmi,0,local_508.J[-1].penalty + 0x30);
    uVar37 = local_508.evenspill * 4 + 4U & 0xfffffff0;
    if (local_508.evenspill < 3) {
      uVar37 = 0;
    }
    (local_508.T)->spadjust = (uint16_t)uVar37;
    if (uVar37 != 0) {
      if (uVar37 + 0x7f < 0x100) {
        local_508.mcp[-1] = (byte)-uVar37;
        local_508.mcp = local_508.mcp + -1;
        uVar45 = 0x830000fe;
      }
      else {
        *(uint *)(local_508.mcp + -4) = -uVar37;
        local_508.mcp = local_508.mcp + -4;
        uVar45 = 0x810000fe;
      }
      local_508.mcp[-1] = 0xc4;
      *(undefined4 *)(local_508.mcp + -5) = uVar45;
      local_508.mcp[-3] = 0x48;
      local_508.mcp = local_508.mcp + -3;
    }
    (local_508.T)->topslot = *(uint8_t *)(((local_508.T)->startpt).gcptr64 + 0xb);
LAB_0013f6ec:
    J = local_160;
    pGVar20 = local_158;
    for (uVar37 = local_508.phiset; unaff_RBP = (IRIns *)(ulong)uVar37, local_160 = J,
        local_158 = pGVar20, uVar37 != 0;
        uVar37 = uVar37 & (-2 << bVar14 | 0xfffffffeU >> 0x20 - bVar14)) {
      uVar52 = uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8 | uVar37 << 0x18;
      uVar44 = 0x1f;
      if (uVar52 != 0) {
        for (; uVar52 >> uVar44 == 0; uVar44 = uVar44 - 1) {
        }
      }
      uVar5 = local_508.phireg[uVar44 ^ 0x18];
      uVar31 = (ulong)uVar5;
      bVar28 = *(byte *)((long)local_508.ir + uVar31 * 8 + 4);
      bVar14 = (byte)(uVar44 ^ 0x18);
      if (((bVar28 & 0x20) != 0) &&
         (*(byte *)((long)local_508.ir + uVar31 * 8 + 4) = bVar28 & 0xdf,
         *(char *)((long)local_508.ir + uVar31 * 8 + 7) != '\0')) {
        ((local_508.J)->fold).ins.field_0.ot = 0x1400;
        ((local_508.J)->fold).ins.field_0.op1 = uVar5;
        ((local_508.J)->fold).ins.field_0.op2 = (IRRef1)local_508.loopsnapno;
        pcStack_530 = (code *)0x13f758;
        TVar18 = lj_ir_emit(local_508.J);
        uVar31 = (ulong)((TVar18 & 0xffff) << 3);
        *(byte *)((long)((local_508.J)->cur).ir + uVar31 + 6) = bVar14;
        *(undefined1 *)((long)((local_508.J)->cur).ir + uVar31 + 7) = 0;
      }
      bVar14 = bVar14 & 0x1f;
      J = local_160;
      pGVar20 = local_158;
    }
    T_00 = J->curfinal;
    if (pGVar20->nins <= T_00->nins) {
      pcStack_530 = (code *)0x13f84c;
      memcpy(T_00->ir + local_508.orignins,pGVar20->ir + local_508.orignins,
             (ulong)(pGVar20->nins - local_508.orignins) << 3);
      pGVar20->nins = J->curfinal->nins;
      local_508.curins = 0x8001;
      pcStack_530 = (code *)0x13f869;
      asm_snap_prev(&local_508);
      if (local_508.freeset == 0xffffbfef) {
        pGVar20->mcode = local_508.mcp;
        MVar19 = 0;
        if (local_508.mcloop != (byte *)0x0) {
          MVar19 = (int)local_508.mcloop - (int)local_508.mcp;
        }
        pGVar20->mcloop = MVar19;
        pbVar34 = local_508.mctop;
        if (local_508.loopref == 0) {
          uVar5 = pGVar20->link;
          uVar7 = (local_508.T)->spadjust;
          if (uVar7 == 0) {
            pbVar34 = local_508.mctop + -7;
          }
          else {
            if ((uint)uVar7 == (int)(char)(byte)uVar7) {
              local_508.mctop[-9] = (byte)uVar7;
              bVar28 = 0x83;
              pbVar34 = local_508.mctop + -3;
            }
            else {
              *(uint *)(local_508.mctop + -9) = (uint)uVar7;
              bVar28 = 0x81;
            }
            local_508.mctop[-0xc] = 0x48;
            local_508.mctop[-0xb] = bVar28;
            local_508.mctop[-10] = 0xc4;
          }
          if ((ulong)uVar5 == 0) {
            iVar56 = 0x12673f;
          }
          else {
            iVar56 = (int)*(undefined8 *)((local_508.J)->trace[uVar5].gcptr64 + 0x58);
          }
          *(int *)(pbVar34 + -4) = iVar56 - (int)pbVar34;
          pbVar34[-5] = 0xe9;
          if (pbVar34 <= local_508.mctop + -1) {
            pbVar33 = local_508.mctop + -2;
            if (pbVar34 + -1 < local_508.mctop + -2) {
              pbVar33 = pbVar34 + -1;
            }
            pcStack_530 = (code *)0x13f958;
            memset(pbVar33 + 1,0x90,(size_t)(local_508.mctop + ~(ulong)pbVar33));
          }
        }
        local_508.mctop = pbVar34;
        pGVar20->szmcode = (int)local_508.mctop - (int)local_508.mcp;
        pSVar8 = (local_508.T)->snap;
        uVar37 = (local_508.T)->nsnap - 1;
        if (uVar37 != 0) {
          uVar31 = (ulong)uVar37;
          puVar26 = &pSVar8[uVar31].mcofs;
          do {
            uVar31 = uVar31 - 1;
            *puVar26 = ((short)local_508.mctoporig - (short)local_508.mcp) -
                       pSVar8[uVar31 & 0xffffffff].mcofs;
            puVar26 = puVar26 + -6;
          } while ((int)uVar31 != 0);
        }
        pSVar8->mcofs = 0;
        pcStack_530 = (code *)0x13f9d9;
        lj_mcode_sync(pGVar20->mcode,local_508.mctoporig);
        return;
      }
      pcStack_530 = asm_snap_prev;
      lj_trace_err(local_508.J,LJ_TRERR_BADRA);
    }
    pcStack_530 = (code *)0x13f7ba;
    lj_trace_free(local_140,T_00);
    J->curfinal = (GCtrace *)0x0;
    pcStack_530 = (code *)0x13f7cf;
    pGVar20 = lj_trace_alloc(J->L,pGVar20);
    J->curfinal = pGVar20;
    local_508.realign = (byte *)0x0;
    goto LAB_0013a764;
  }
  pIVar55 = (local_508.parent)->ir;
  if ((local_508.snapno != 0) && ((local_508.parent)->topslot < local_508.topslot)) {
    pcStack_530 = (code *)0x13eef5;
    asm_snap_alloc(&local_508,0);
  }
  bVar28 = *(byte *)((long)local_508.ir + 0x40006);
  if ((char)bVar28 < '\0') {
    local_528.field_1.op12 = 0xffffbfef;
  }
  else {
    uVar37 = (uint)bVar28;
    uVar44 = local_508.freeset | 1 << (uVar37 & 0x1f);
    local_508.freeset = uVar44;
    if (((local_508.modset >> (uVar37 & 0x1f) & 1) != 0) ||
       ((*(byte *)((long)local_508.ir + 0x40004) & 0x20) != 0)) {
      *(undefined1 *)((long)local_508.ir + 0x40006) = 0xff;
    }
    bVar14 = *(byte *)((long)pIVar55 + 0x40006);
    if (bVar14 != bVar28) {
      if (((char)bVar14 < '\0') || ((uVar44 >> (bVar14 & 0x1f) & 1) == 0)) {
        local_528.field_1.op12 = 0xffffbfef;
        pcStack_530 = (code *)0x13f106;
        emit_rma(&local_508,XO_MOV,uVar37 | 0x80200,local_508.J[-1].penalty + 0x3c);
        goto LAB_0013f106;
      }
      local_508.mcp[-1] = bVar14 & 7 | bVar28 * '\b' | 0xc0;
      local_508.mcp[-2] = 0x8b;
      local_508.mcp[-3] = bVar14 >> 3 & 1 | bVar28 >> 1 & 4 | 0x48;
      local_508.mcp = local_508.mcp + -3;
      bVar28 = bVar14;
    }
    local_528 = (IRIns)(CONCAT44(local_528._4_4_,1 << (bVar28 & 0x1f)) ^ 0xffffbfef);
  }
LAB_0013f106:
  local_178 = pIVar55;
  uVar31 = (ulong)local_508.stopins;
  if (uVar31 < 0x8001) {
    local_518 = (ulong)local_518._4_4_ << 0x20;
    bVar58 = true;
    local_51c = 0;
  }
  else {
    puVar38 = auStack_10372 + uVar31;
    lVar25 = uVar31 << 3;
    local_51c = 0;
    local_510 = (IRIns *)((ulong)local_510 & 0xffffffff00000000);
    local_518 = (ulong)local_518._4_4_ << 0x20;
    do {
      pIVar21 = local_508.ir;
      pIVar55 = (IRIns *)((long)local_508.ir + lVar25);
      uVar5 = *puVar38;
      bVar28 = *(byte *)((long)local_508.ir + lVar25 + 6);
      if ((char)bVar28 < '\0') {
        if (*(char *)((long)local_508.ir + lVar25 + 7) != '\0') {
          pbVar34 = (byte *)((long)local_508.ir + lVar25 + 4);
          *pbVar34 = *pbVar34 | 0x20;
          local_510 = (IRIns *)CONCAT44(local_510._4_4_,1);
        }
      }
      else {
        local_528.field_1.op12 = local_528._0_4_ & ~(1 << (bVar28 & 0x1f));
        bVar14 = *(byte *)((long)local_508.ir + lVar25 + 7);
        if (bVar14 != 0) {
          pcStack_530 = (code *)0x13f197;
          emit_storeofs(&local_508,pIVar55,(uint)bVar28,4,(uint)bVar14 << 2);
          if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
        }
      }
      bVar28 = (pIVar55->field_1).r;
      if (bVar28 == uVar5) {
        local_508.freeset = local_508.freeset | 1 << (bVar28 & 0x1f);
      }
      else if (uVar5 < 0x100) {
        if ((-1 < (char)bVar28) || (*(char *)((long)pIVar21 + lVar25 + 7) != '\0')) {
          *(short *)((long)&local_138 + (ulong)uVar5 * 2) = (short)uVar31;
          local_51c = local_51c | 1 << (uVar5 & 0x1f);
        }
      }
      else {
        uVar45 = (int)local_518;
        if (-1 < (char)bVar28) {
          uVar45 = 1;
        }
        local_518 = CONCAT44(local_518._4_4_,uVar45);
      }
      uVar37 = (int)uVar31 - 1;
      uVar31 = (ulong)uVar37;
      puVar38 = puVar38 + -1;
      lVar25 = lVar25 + -8;
    } while (0x8000 < uVar37);
    bVar58 = (int)local_510 == 0;
  }
  uVar37 = local_508.evenspill * 4 + 4U & 0xfffffff0;
  if (local_508.evenspill < 3) {
    uVar37 = 0;
  }
  local_16c = uVar37 - (local_508.parent)->spadjust;
  local_168 = 0;
  if (0 < (int)local_16c) {
    local_168 = (ulong)local_16c;
  }
  if ((int)local_16c < 0) {
    uVar37 = (uint)(local_508.parent)->spadjust;
  }
  (local_508.T)->spadjust = (uint16_t)uVar37;
  uVar45 = local_528._0_4_;
  if ((!bVar58) && (uVar31 = (ulong)local_508.stopins, 0x8000 < uVar31)) {
    puVar38 = auStack_10372 + uVar31;
    lVar25 = uVar31 << 3;
    do {
      pIVar55 = local_508.ir;
      bVar28 = *(byte *)((long)local_508.ir + lVar25 + 4);
      if ((bVar28 & 0x20) != 0) {
        *(byte *)((long)local_508.ir + lVar25 + 4) = bVar28 & 0xdf;
        uVar5 = *puVar38;
        if (uVar5 < 0x100) {
          *(byte *)((long)local_508.ir + lVar25 + 6) = (byte)uVar5 | 0x80;
        }
        else if ((int)local_168 + (uint)(uVar5 >> 8) * 4 ==
                 (uint)*(byte *)((long)local_508.ir + lVar25 + 7) << 2) goto LAB_0013f3f5;
        uVar37 = 0xffff0000;
        if (1 < (byte)((*(byte *)((long)local_508.ir + lVar25 + 4) & 0x1f) - 0xd)) {
          uVar37 = 0xbfef;
        }
        local_528.field_1.op12 = uVar45;
        if ((uVar37 & uVar45) == 0) goto LAB_0013f9f8;
        local_510 = (IRIns *)((long)local_508.ir + lVar25);
        pcStack_530 = (code *)0x13f371;
        RVar15 = ra_allocref(&local_508,(IRRef)uVar31,uVar37 & uVar45);
        pcStack_530 = (code *)0x13f394;
        emit_storeofs(&local_508,local_510,RVar15,4,(uint)*(byte *)((long)pIVar55 + lVar25 + 7) << 2
                     );
        bVar28 = (byte)RVar15 & 0x1f;
        if (RVar15 == uVar5) {
          local_508.freeset = local_508.freeset | 1 << ((byte)RVar15 & 0x1f);
          uVar37 = local_51c & (-2 << bVar28 | 0xfffffffeU >> 0x20 - bVar28);
        }
        else {
          uVar45 = (int)local_518;
          if (0xff < uVar5) {
            uVar45 = 1;
          }
          local_518 = CONCAT44(local_518._4_4_,uVar45);
          uVar37 = local_51c;
        }
        if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
        uVar45 = local_528._0_4_ & ~(1 << (RVar15 & 0x1f));
        local_51c = uVar37;
      }
LAB_0013f3f5:
      uVar37 = (IRRef)uVar31 - 1;
      uVar31 = (ulong)uVar37;
      puVar38 = puVar38 + -1;
      lVar25 = lVar25 + -8;
    } while (0x8000 < uVar37);
  }
  *(uint *)(local_508.mcp + -4) = (uint)(local_508.T)->traceno;
  local_508.mcp = local_508.mcp + -4;
  pcStack_530 = (code *)0x13f456;
  emit_rma(&local_508,XO_MOVmi,0,local_508.J[-1].penalty + 0x30);
  pIVar55 = local_178;
  if (0 < (int)local_16c) {
    if ((int)local_16c < 0x81) {
      local_508.mcp[-1] = (byte)-(int)local_168;
      local_508.mcp = local_508.mcp + -1;
      uVar24 = 0x830000fe;
    }
    else {
      *(int *)(local_508.mcp + -4) = -(int)local_168;
      local_508.mcp = local_508.mcp + -4;
      uVar24 = 0x810000fe;
    }
    local_508.mcp[-1] = 0xc4;
    *(undefined4 *)(local_508.mcp + -5) = uVar24;
    local_508.mcp[-3] = 0x48;
    local_508.mcp = local_508.mcp + -3;
  }
  if ((int)local_518 != 0) {
    if ((local_508.freeset & 0xffffbfef) != 0xffffbfef) {
      uVar37 = local_508.freeset & 0xffffbfef ^ 0xffffbfef;
      do {
        uVar44 = 0;
        if (uVar37 != 0) {
          for (; (uVar37 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
          }
        }
        uVar5 = (ushort)local_508.cost[uVar44];
        if (0xff < local_508.parentmap[uVar5 - 0x8001]) {
          local_508.freeset = local_508.freeset | 1 << ((byte)uVar44 & 0x1f);
          pcStack_530 = (code *)0x13f52a;
          emit_loadofs(&local_508,local_508.ir + uVar5,uVar44,4,
                       local_508.parentmap[uVar5 - 0x8001] >> 6 & 0xfffffffc);
          if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
        }
        uVar37 = uVar37 & ~(1 << (uVar44 & 0x1f));
      } while (uVar37 != 0);
    }
  }
  local_178 = pIVar55 + 0x8000;
  uVar37 = local_51c;
  do {
    uVar44 = uVar37 & 0xbfef;
    local_528.field_1.op12 = uVar45;
    local_51c = 0;
    if (uVar44 != 0) {
      for (; (uVar44 >> local_51c & 1) == 0; local_51c = local_51c + 1) {
      }
    }
    uVar52 = uVar37 & 0xffff0000;
    RVar15 = 0;
    if (uVar52 != 0) {
      for (; (uVar52 >> RVar15 & 1) == 0; RVar15 = RVar15 + 1) {
      }
    }
    while( true ) {
      uVar50 = local_508.freeset & uVar37;
      if (uVar50 != 0) break;
      if (uVar37 == 0) {
        bVar28 = (local_508.parent)->topslot;
        (local_508.T)->topslot = bVar28;
        if (bVar28 < local_508.topslot) {
          exitno = (local_508.J)->exitno;
          (local_508.T)->topslot = (uint8_t)local_508.topslot;
          pcStack_530 = (code *)0x13f6ae;
          asm_stack_check(&local_508,local_508.topslot,local_178,local_528._0_4_ & 0xbfef,exitno);
        }
        goto LAB_0013f6ec;
      }
      if (uVar44 != 0) {
        uVar50 = local_508.freeset & (uVar44 ^ 0xbfef) & uVar45;
        if (uVar50 == 0) goto LAB_0013f9f8;
        RVar17 = 0;
        if (uVar50 != 0) {
          for (; (uVar50 >> RVar17 & 1) == 0; RVar17 = RVar17 + 1) {
          }
        }
        pcStack_530 = (code *)0x13f5c3;
        ra_rename(&local_508,local_51c,RVar17);
      }
      if (uVar52 != 0) {
        uVar50 = local_508.freeset & (uVar52 ^ 0xffff0000) & local_528._0_4_;
        if (uVar50 == 0) goto LAB_0013f9f8;
        RVar17 = 0;
        if (uVar50 != 0) {
          for (; (uVar50 >> RVar17 & 1) == 0; RVar17 = RVar17 + 1) {
          }
        }
        pcStack_530 = (code *)0x13f5ed;
        ra_rename(&local_508,RVar15,RVar17);
      }
      if (local_508.mcp < local_508.mclim) goto LAB_0013f81a;
    }
    uVar44 = 0;
    if (uVar50 != 0) {
      for (; (uVar50 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
      }
    }
    pIVar55 = local_508.ir + *(ushort *)((long)&local_138 + (ulong)uVar44 * 2);
    uVar37 = uVar37 & ~(1 << (uVar44 & 0x1f));
    uVar45 = local_528._0_4_ & ~(1 << (uVar44 & 0x1f));
    local_508.freeset = local_508.freeset | 1 << ((pIVar55->field_1).r & 0x1f);
    pcStack_530 = (code *)0x13f643;
    emit_movrr(&local_508,pIVar55,(uint)(pIVar55->field_1).r,uVar44);
  } while (local_508.mclim <= local_508.mcp);
  goto LAB_0013f81a;
}

Assistant:

void lj_asm_trace(jit_State *J, GCtrace *T)
{
  ASMState as_;
  ASMState *as = &as_;

  /* Remove nops/renames left over from ASM restart due to LJ_TRERR_MCODELM. */
  {
    IRRef nins = T->nins;
    IRIns *ir = &T->ir[nins-1];
    if (ir->o == IR_NOP || ir->o == IR_RENAME) {
      do { ir--; nins--; } while (ir->o == IR_NOP || ir->o == IR_RENAME);
      T->nins = nins;
    }
  }

  /* Ensure an initialized instruction beyond the last one for HIOP checks. */
  /* This also allows one RENAME to be added without reallocating curfinal. */
  as->orignins = lj_ir_nextins(J);
  lj_ir_nop(&J->cur.ir[as->orignins]);

  /* Setup initial state. Copy some fields to reduce indirections. */
  as->J = J;
  as->T = T;
  J->curfinal = lj_trace_alloc(J->L, T);  /* This copies the IR, too. */
  as->flags = J->flags;
  as->loopref = J->loopref;
  as->realign = NULL;
  as->loopinv = 0;
  as->parent = J->parent ? traceref(J, J->parent) : NULL;

  /* Reserve MCode memory. */
  as->mctop = as->mctoporig = lj_mcode_reserve(J, &as->mcbot);
  as->mcp = as->mctop;
  as->mclim = as->mcbot + MCLIM_REDZONE;
  asm_setup_target(as);

  /*
  ** This is a loop, because the MCode may have to be (re-)assembled
  ** multiple times:
  **
  ** 1. as->realign is set (and the assembly aborted), if the arch-specific
  **    backend wants the MCode to be aligned differently.
  **
  **    This is currently only the case on x86/x64, where small loops get
  **    an aligned loop body plus a short branch. Not much effort is wasted,
  **    because the abort happens very quickly and only once.
  **
  ** 2. The IR is immovable, since the MCode embeds pointers to various
  **    constants inside the IR. But RENAMEs may need to be added to the IR
  **    during assembly, which might grow and reallocate the IR. We check
  **    at the end if the IR (in J->cur.ir) has actually grown, resize the
  **    copy (in J->curfinal.ir) and try again.
  **
  **    95% of all traces have zero RENAMEs, 3% have one RENAME, 1.5% have
  **    2 RENAMEs and only 0.5% have more than that. That's why we opt to
  **    always have one spare slot in the IR (see above), which means we
  **    have to redo the assembly for only ~2% of all traces.
  **
  **    Very, very rarely, this needs to be done repeatedly, since the
  **    location of constants inside the IR (actually, reachability from
  **    a global pointer) may affect register allocation and thus the
  **    number of RENAMEs.
  */
  for (;;) {
    as->mcp = as->mctop;
#ifdef LUA_USE_ASSERT
    as->mcp_prev = as->mcp;
#endif
    as->ir = J->curfinal->ir;  /* Use the copied IR. */
    as->curins = J->cur.nins = as->orignins;

    RA_DBG_START();
    RA_DBGX((as, "===== STOP ====="));

    /* General trace setup. Emit tail of trace. */
    asm_tail_prep(as);
    as->mcloop = NULL;
    as->flagmcp = NULL;
    as->topslot = 0;
    as->gcsteps = 0;
    as->sectref = as->loopref;
    as->fuseref = (as->flags & JIT_F_OPT_FUSE) ? as->loopref : FUSE_DISABLED;
    asm_setup_regsp(as);
    if (!as->loopref)
      asm_tail_link(as);

    /* Assemble a trace in linear backwards order. */
    for (as->curins--; as->curins > as->stopins; as->curins--) {
      IRIns *ir = IR(as->curins);
      /* 64 bit types handled by SPLIT for 32 bit archs. */
      lj_assertA(!(LJ_32 && irt_isint64(ir->t)),
		 "IR %04d has unsplit 64 bit type",
		 (int)(ir - as->ir) - REF_BIAS);
      asm_snap_prev(as);
      if (!ra_used(ir) && !ir_sideeff(ir) && (as->flags & JIT_F_OPT_DCE))
	continue;  /* Dead-code elimination can be soooo easy. */
      if (irt_isguard(ir->t))
	asm_snap_prep(as);
      RA_DBG_REF();
      checkmclim(as);
      asm_ir(as, ir);
    }

    if (as->realign && J->curfinal->nins >= T->nins)
      continue;  /* Retry in case only the MCode needs to be realigned. */

    /* Emit head of trace. */
    RA_DBG_REF();
    checkmclim(as);
    if (as->gcsteps > 0) {
      as->curins = as->T->snap[0].ref;
      asm_snap_prep(as);  /* The GC check is a guard. */
      asm_gc_check(as);
      as->curins = as->stopins;
    }
    ra_evictk(as);
    if (as->parent)
      asm_head_side(as);
    else
      asm_head_root(as);
    asm_phi_fixup(as);

    if (J->curfinal->nins >= T->nins) {  /* IR didn't grow? */
      lj_assertA(J->curfinal->nk == T->nk, "unexpected IR constant growth");
      memcpy(J->curfinal->ir + as->orignins, T->ir + as->orignins,
	     (T->nins - as->orignins) * sizeof(IRIns));  /* Copy RENAMEs. */
      T->nins = J->curfinal->nins;
      /* Fill mcofs of any unprocessed snapshots. */
      as->curins = REF_FIRST;
      asm_snap_prev(as);
      break;  /* Done. */
    }

    /* Otherwise try again with a bigger IR. */
    lj_trace_free(J2G(J), J->curfinal);
    J->curfinal = NULL;  /* In case lj_trace_alloc() OOMs. */
    J->curfinal = lj_trace_alloc(J->L, T);
    as->realign = NULL;
  }

  RA_DBGX((as, "===== START ===="));
  RA_DBG_FLUSH();
  if (as->freeset != RSET_ALL)
    lj_trace_err(as->J, LJ_TRERR_BADRA);  /* Ouch! Should never happen. */

  /* Set trace entry point before fixing up tail to allow link to self. */
  T->mcode = as->mcp;
  T->mcloop = as->mcloop ? (MSize)((char *)as->mcloop - (char *)as->mcp) : 0;
  if (as->loopref)
    asm_loop_tail_fixup(as);
  else
    asm_tail_fixup(as, T->link);  /* Note: this may change as->mctop! */
  T->szmcode = (MSize)((char *)as->mctop - (char *)as->mcp);
  asm_snap_fixup_mcofs(as);
#if LJ_TARGET_MCODE_FIXUP
  asm_mcode_fixup(T->mcode, T->szmcode);
#endif
  lj_mcode_sync(T->mcode, as->mctoporig);
}